

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx512::SubGridMBIntersectorKPluecker<4,_8,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float *pfVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  BBox1f BVar11;
  ushort uVar12;
  ushort uVar13;
  Geometry *pGVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  RTCFilterFunctionN p_Var19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  float fVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  byte bVar31;
  uint uVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  size_t sVar38;
  RayHitK<8> *pRVar39;
  byte bVar40;
  AABBNodeMB4D *node1;
  ulong uVar41;
  long lVar42;
  long lVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  ulong uVar48;
  long lVar49;
  long lVar50;
  ulong *puVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  long lVar57;
  ulong uVar58;
  ulong uVar59;
  float fVar60;
  float fVar116;
  float fVar117;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar118;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  vint4 ai;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  vint4 ai_2;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar132;
  vint4 bi;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar135;
  vint4 ai_6;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  vint4 bi_2;
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  vint4 bi_6;
  undefined1 auVar142 [16];
  undefined1 auVar143 [64];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [64];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  UVIdentity<8> mapUV;
  RTCFilterFunctionNArguments args;
  vfloat<4> dist;
  vfloat<4> tNear;
  vint<8> itime;
  vfloat<8> ftime;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_147d;
  uint local_147c;
  uint local_1478;
  uint local_1474;
  undefined1 local_1470 [16];
  ulong local_1460;
  size_t local_1458;
  long local_1450;
  long local_1448;
  ulong local_1440;
  ulong local_1438;
  ulong local_1430;
  ulong local_1428;
  ulong local_1420;
  ulong local_1418;
  RayHitK<8> *local_1410;
  ulong local_1408;
  ulong *local_1400;
  long local_13f8;
  long local_13f0;
  long local_13e8;
  Scene *local_13e0;
  ulong local_13d8;
  RTCFilterFunctionNArguments local_13d0;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  undefined1 local_1300 [16];
  undefined1 local_12f0 [16];
  undefined1 local_12e0 [16];
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [16];
  undefined1 local_12b0 [16];
  undefined1 local_12a0 [16];
  undefined1 local_1290 [16];
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 *local_1200;
  byte local_11f8;
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  uint uStack_1164;
  float local_1160 [4];
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  uint uStack_1144;
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  float fStack_10a4;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  ulong local_f90 [492];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ulong uVar47;
  
  puVar51 = local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar8 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_12e0._4_4_ = uVar8;
  local_12e0._0_4_ = uVar8;
  local_12e0._8_4_ = uVar8;
  local_12e0._12_4_ = uVar8;
  auVar147 = ZEXT1664(local_12e0);
  uVar8 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_12f0._4_4_ = uVar8;
  local_12f0._0_4_ = uVar8;
  local_12f0._8_4_ = uVar8;
  local_12f0._12_4_ = uVar8;
  auVar143 = ZEXT1664(local_12f0);
  uVar8 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1290._4_4_ = uVar8;
  local_1290._0_4_ = uVar8;
  local_1290._8_4_ = uVar8;
  local_1290._12_4_ = uVar8;
  auVar164 = ZEXT1664(local_1290);
  fVar135 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar132 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar60 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar116 = fVar135 * 0.99999964;
  local_1300._4_4_ = fVar116;
  local_1300._0_4_ = fVar116;
  local_1300._8_4_ = fVar116;
  local_1300._12_4_ = fVar116;
  auVar159 = ZEXT1664(local_1300);
  fVar116 = fVar132 * 0.99999964;
  local_1310._4_4_ = fVar116;
  local_1310._0_4_ = fVar116;
  local_1310._8_4_ = fVar116;
  local_1310._12_4_ = fVar116;
  auVar160 = ZEXT1664(local_1310);
  fVar116 = fVar60 * 0.99999964;
  local_1320._4_4_ = fVar116;
  local_1320._0_4_ = fVar116;
  local_1320._8_4_ = fVar116;
  local_1320._12_4_ = fVar116;
  auVar162 = ZEXT1664(local_1320);
  local_12a0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar135 * 1.0000004)));
  auVar165 = ZEXT1664(local_12a0);
  local_12b0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar132 * 1.0000004)));
  auVar166 = ZEXT1664(local_12b0);
  local_12c0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar60 * 1.0000004)));
  auVar167 = ZEXT1664(local_12c0);
  uVar52 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar53 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar54 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar58 = uVar52 ^ 0x10;
  uVar55 = uVar53 ^ 0x10;
  auVar61 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar168 = ZEXT1664(auVar61);
  auVar62 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar169 = ZEXT1664(auVar62);
  uVar56 = uVar54 ^ 0x10;
  local_1120 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_12d0 = vmovdqa64_avx512vl(auVar61);
  local_1458 = k;
  local_1440 = uVar56;
  local_1438 = uVar55;
  local_1430 = uVar58;
  local_1428 = uVar54;
  local_1420 = uVar53;
  local_1418 = uVar52;
  local_1410 = ray;
LAB_01d646e3:
  do {
    do {
      if (puVar51 == &local_fa0) {
        return;
      }
      pfVar7 = (float *)(puVar51 + -1);
      puVar51 = puVar51 + -2;
    } while (*(float *)(ray + k * 4 + 0x100) < *pfVar7);
    uVar59 = *puVar51;
    while( true ) {
      if ((uVar59 & 8) != 0) break;
      uVar41 = uVar59 & 0xfffffffffffffff0;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar122._4_4_ = uVar8;
      auVar122._0_4_ = uVar8;
      auVar122._8_4_ = uVar8;
      auVar122._12_4_ = uVar8;
      auVar61 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar41 + 0x80 + uVar52),auVar122,
                                *(undefined1 (*) [16])(uVar41 + 0x20 + uVar52));
      auVar77 = auVar147._0_16_;
      auVar61 = vsubps_avx(auVar61,auVar77);
      auVar62 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar41 + 0x80 + uVar53),auVar122,
                                *(undefined1 (*) [16])(uVar41 + 0x20 + uVar53));
      auVar129._0_4_ = auVar159._0_4_ * auVar61._0_4_;
      auVar129._4_4_ = auVar159._4_4_ * auVar61._4_4_;
      auVar129._8_4_ = auVar159._8_4_ * auVar61._8_4_;
      auVar129._12_4_ = auVar159._12_4_ * auVar61._12_4_;
      auVar78 = auVar143._0_16_;
      auVar61 = vsubps_avx(auVar62,auVar78);
      auVar62 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar41 + 0x80 + uVar54),auVar122,
                                *(undefined1 (*) [16])(uVar41 + 0x20 + uVar54));
      auVar133._0_4_ = auVar160._0_4_ * auVar61._0_4_;
      auVar133._4_4_ = auVar160._4_4_ * auVar61._4_4_;
      auVar133._8_4_ = auVar160._8_4_ * auVar61._8_4_;
      auVar133._12_4_ = auVar160._12_4_ * auVar61._12_4_;
      auVar61 = vsubps_avx(auVar62,auVar164._0_16_);
      auVar136._0_4_ = auVar162._0_4_ * auVar61._0_4_;
      auVar136._4_4_ = auVar162._4_4_ * auVar61._4_4_;
      auVar136._8_4_ = auVar162._8_4_ * auVar61._8_4_;
      auVar136._12_4_ = auVar162._12_4_ * auVar61._12_4_;
      auVar61 = vmaxps_avx(auVar133,auVar136);
      auVar62 = vmaxps_avx512vl(auVar168._0_16_,auVar129);
      auVar61 = vmaxps_avx(auVar62,auVar61);
      auVar62 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar41 + 0x80 + uVar58),auVar122,
                                *(undefined1 (*) [16])(uVar41 + 0x20 + uVar58));
      auVar62 = vsubps_avx(auVar62,auVar77);
      auVar63 = vmulps_avx512vl(auVar165._0_16_,auVar62);
      auVar62 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar41 + 0x80 + uVar55),auVar122,
                                *(undefined1 (*) [16])(uVar41 + 0x20 + uVar55));
      auVar62 = vsubps_avx(auVar62,auVar78);
      auVar64 = vmulps_avx512vl(auVar166._0_16_,auVar62);
      auVar62 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar41 + 0x80 + uVar56),auVar122,
                                *(undefined1 (*) [16])(uVar41 + 0x20 + uVar56));
      auVar62 = vsubps_avx(auVar62,auVar164._0_16_);
      auVar62 = vmulps_avx512vl(auVar167._0_16_,auVar62);
      auVar62 = vminps_avx(auVar64,auVar62);
      auVar63 = vminps_avx512vl(auVar169._0_16_,auVar63);
      auVar62 = vminps_avx(auVar63,auVar62);
      uVar28 = vcmpps_avx512vl(auVar61,auVar62,2);
      uVar44 = (uint)uVar28;
      if (((uint)uVar59 & 7) == 6) {
        uVar29 = vcmpps_avx512vl(auVar122,*(undefined1 (*) [16])(uVar41 + 0xf0),1);
        uVar30 = vcmpps_avx512vl(auVar122,*(undefined1 (*) [16])(uVar41 + 0xe0),0xd);
        uVar44 = (uint)(byte)((byte)uVar29 & (byte)uVar30 & (byte)uVar28);
      }
      local_1260._0_16_ = auVar61;
      if ((byte)uVar44 == 0) goto LAB_01d646e3;
      lVar42 = 0;
      for (uVar59 = (ulong)(byte)uVar44; (uVar59 & 1) == 0;
          uVar59 = uVar59 >> 1 | 0x8000000000000000) {
        lVar42 = lVar42 + 1;
      }
      uVar59 = *(ulong *)(uVar41 + lVar42 * 8);
      uVar44 = (uVar44 & 0xff) - 1 & uVar44 & 0xff;
      uVar47 = (ulong)uVar44;
      if (uVar44 != 0) {
        uVar46 = *(uint *)(local_1260 + lVar42 * 4);
        lVar42 = 0;
        for (; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000) {
          lVar42 = lVar42 + 1;
        }
        uVar44 = uVar44 - 1 & uVar44;
        uVar48 = (ulong)uVar44;
        uVar47 = *(ulong *)(uVar41 + lVar42 * 8);
        uVar45 = *(uint *)(local_1260 + lVar42 * 4);
        if (uVar44 == 0) {
          if (uVar46 < uVar45) {
            *puVar51 = uVar47;
            *(uint *)(puVar51 + 1) = uVar45;
            puVar51 = puVar51 + 2;
          }
          else {
            *puVar51 = uVar59;
            *(uint *)(puVar51 + 1) = uVar46;
            uVar59 = uVar47;
            puVar51 = puVar51 + 2;
          }
        }
        else {
          auVar123._8_8_ = 0;
          auVar123._0_8_ = uVar59;
          auVar61 = vpunpcklqdq_avx(auVar123,ZEXT416(uVar46));
          auVar130._8_8_ = 0;
          auVar130._0_8_ = uVar47;
          auVar62 = vpunpcklqdq_avx(auVar130,ZEXT416(uVar45));
          lVar42 = 0;
          for (; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
            lVar42 = lVar42 + 1;
          }
          uVar44 = uVar44 - 1 & uVar44;
          uVar59 = (ulong)uVar44;
          auVar131._8_8_ = 0;
          auVar131._0_8_ = *(ulong *)(uVar41 + lVar42 * 8);
          auVar124 = vpunpcklqdq_avx(auVar131,ZEXT416(*(uint *)(local_1260 + lVar42 * 4)));
          auVar63 = vpshufd_avx(auVar61,0xaa);
          auVar64 = vpshufd_avx(auVar62,0xaa);
          auVar137 = vpshufd_avx(auVar124,0xaa);
          if (uVar44 == 0) {
            uVar59 = vpcmpgtd_avx512vl(auVar64,auVar63);
            uVar59 = uVar59 & 0xf;
            auVar64 = vpblendmd_avx512vl(auVar62,auVar61);
            bVar20 = (bool)((byte)uVar59 & 1);
            auVar65._0_4_ = (uint)bVar20 * auVar64._0_4_ | (uint)!bVar20 * auVar63._0_4_;
            bVar20 = (bool)((byte)(uVar59 >> 1) & 1);
            auVar65._4_4_ = (uint)bVar20 * auVar64._4_4_ | (uint)!bVar20 * auVar63._4_4_;
            bVar20 = (bool)((byte)(uVar59 >> 2) & 1);
            auVar65._8_4_ = (uint)bVar20 * auVar64._8_4_ | (uint)!bVar20 * auVar63._8_4_;
            bVar20 = SUB81(uVar59 >> 3,0);
            auVar65._12_4_ = (uint)bVar20 * auVar64._12_4_ | (uint)!bVar20 * auVar63._12_4_;
            auVar62 = vmovdqa32_avx512vl(auVar62);
            bVar20 = (bool)((byte)uVar59 & 1);
            auVar66._0_4_ = (uint)bVar20 * auVar62._0_4_ | (uint)!bVar20 * auVar61._0_4_;
            bVar20 = (bool)((byte)(uVar59 >> 1) & 1);
            auVar66._4_4_ = (uint)bVar20 * auVar62._4_4_ | (uint)!bVar20 * auVar61._4_4_;
            bVar20 = (bool)((byte)(uVar59 >> 2) & 1);
            auVar66._8_4_ = (uint)bVar20 * auVar62._8_4_ | (uint)!bVar20 * auVar61._8_4_;
            bVar20 = SUB81(uVar59 >> 3,0);
            auVar66._12_4_ = (uint)bVar20 * auVar62._12_4_ | (uint)!bVar20 * auVar61._12_4_;
            auVar61 = vpshufd_avx(auVar65,0xaa);
            uVar41 = vpcmpgtd_avx512vl(auVar137,auVar61);
            uVar41 = uVar41 & 0xf;
            auVar62 = vpblendmd_avx512vl(auVar124,auVar65);
            bVar20 = (bool)((byte)uVar41 & 1);
            bVar21 = (bool)((byte)(uVar41 >> 1) & 1);
            uVar59 = CONCAT44((uint)bVar21 * auVar62._4_4_ | (uint)!bVar21 * auVar61._4_4_,
                              (uint)bVar20 * auVar62._0_4_ | (uint)!bVar20 * auVar61._0_4_);
            auVar61 = vmovdqa32_avx512vl(auVar124);
            bVar20 = (bool)((byte)uVar41 & 1);
            auVar67._0_4_ = (uint)bVar20 * auVar61._0_4_ | !bVar20 * auVar65._0_4_;
            bVar20 = (bool)((byte)(uVar41 >> 1) & 1);
            auVar67._4_4_ = (uint)bVar20 * auVar61._4_4_ | !bVar20 * auVar65._4_4_;
            bVar20 = (bool)((byte)(uVar41 >> 2) & 1);
            auVar67._8_4_ = (uint)bVar20 * auVar61._8_4_ | !bVar20 * auVar65._8_4_;
            bVar20 = SUB81(uVar41 >> 3,0);
            auVar67._12_4_ = (uint)bVar20 * auVar61._12_4_ | !bVar20 * auVar65._12_4_;
            auVar61 = vpshufd_avx(auVar67,0xaa);
            auVar62 = vpshufd_avx(auVar66,0xaa);
            uVar41 = vpcmpgtd_avx512vl(auVar61,auVar62);
            uVar41 = uVar41 & 0xf;
            auVar62 = vpblendmd_avx512vl(auVar67,auVar66);
            bVar20 = (bool)((byte)uVar41 & 1);
            auVar68._0_4_ = (uint)bVar20 * auVar62._0_4_ | (uint)!bVar20 * auVar61._0_4_;
            bVar20 = (bool)((byte)(uVar41 >> 1) & 1);
            auVar68._4_4_ = (uint)bVar20 * auVar62._4_4_ | (uint)!bVar20 * auVar61._4_4_;
            bVar20 = (bool)((byte)(uVar41 >> 2) & 1);
            auVar68._8_4_ = (uint)bVar20 * auVar62._8_4_ | (uint)!bVar20 * auVar61._8_4_;
            bVar20 = SUB81(uVar41 >> 3,0);
            auVar68._12_4_ = (uint)bVar20 * auVar62._12_4_ | (uint)!bVar20 * auVar61._12_4_;
            auVar61 = vmovdqa32_avx512vl(auVar67);
            bVar20 = (bool)((byte)uVar41 & 1);
            bVar21 = (bool)((byte)(uVar41 >> 1) & 1);
            bVar22 = (bool)((byte)(uVar41 >> 2) & 1);
            bVar24 = SUB81(uVar41 >> 3,0);
            *(uint *)puVar51 = (uint)bVar20 * auVar61._0_4_ | !bVar20 * auVar66._0_4_;
            *(uint *)((long)puVar51 + 4) = (uint)bVar21 * auVar61._4_4_ | !bVar21 * auVar66._4_4_;
            *(uint *)(puVar51 + 1) = (uint)bVar22 * auVar61._8_4_ | !bVar22 * auVar66._8_4_;
            *(uint *)((long)puVar51 + 0xc) =
                 (uint)bVar24 * auVar61._12_4_ | !bVar24 * auVar66._12_4_;
            *(undefined1 (*) [16])(puVar51 + 2) = auVar68;
            puVar51 = puVar51 + 4;
          }
          else {
            lVar42 = 0;
            for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
              lVar42 = lVar42 + 1;
            }
            uVar44 = *(uint *)(local_1260 + lVar42 * 4);
            auVar144._8_8_ = 0;
            auVar144._0_8_ = *(ulong *)(uVar41 + lVar42 * 8);
            auVar87 = vpunpcklqdq_avx(auVar144,ZEXT416(uVar44));
            uVar59 = vpcmpgtd_avx512vl(auVar64,auVar63);
            uVar59 = uVar59 & 0xf;
            auVar64 = vpblendmd_avx512vl(auVar62,auVar61);
            bVar20 = (bool)((byte)uVar59 & 1);
            auVar69._0_4_ = (uint)bVar20 * auVar64._0_4_ | (uint)!bVar20 * auVar63._0_4_;
            bVar20 = (bool)((byte)(uVar59 >> 1) & 1);
            auVar69._4_4_ = (uint)bVar20 * auVar64._4_4_ | (uint)!bVar20 * auVar63._4_4_;
            bVar20 = (bool)((byte)(uVar59 >> 2) & 1);
            auVar69._8_4_ = (uint)bVar20 * auVar64._8_4_ | (uint)!bVar20 * auVar63._8_4_;
            bVar20 = SUB81(uVar59 >> 3,0);
            auVar69._12_4_ = (uint)bVar20 * auVar64._12_4_ | (uint)!bVar20 * auVar63._12_4_;
            auVar62 = vmovdqa32_avx512vl(auVar62);
            bVar20 = (bool)((byte)uVar59 & 1);
            auVar70._0_4_ = (uint)bVar20 * auVar62._0_4_ | (uint)!bVar20 * auVar61._0_4_;
            bVar20 = (bool)((byte)(uVar59 >> 1) & 1);
            auVar70._4_4_ = (uint)bVar20 * auVar62._4_4_ | (uint)!bVar20 * auVar61._4_4_;
            bVar20 = (bool)((byte)(uVar59 >> 2) & 1);
            auVar70._8_4_ = (uint)bVar20 * auVar62._8_4_ | (uint)!bVar20 * auVar61._8_4_;
            bVar20 = SUB81(uVar59 >> 3,0);
            auVar70._12_4_ = (uint)bVar20 * auVar62._12_4_ | (uint)!bVar20 * auVar61._12_4_;
            auVar134._4_4_ = uVar44;
            auVar134._0_4_ = uVar44;
            auVar134._8_4_ = uVar44;
            auVar134._12_4_ = uVar44;
            uVar59 = vpcmpgtd_avx512vl(auVar134,auVar137);
            uVar59 = uVar59 & 0xf;
            auVar61 = vpblendmd_avx512vl(auVar87,auVar124);
            bVar20 = (bool)((byte)uVar59 & 1);
            auVar71._0_4_ = (uint)bVar20 * auVar61._0_4_ | !bVar20 * uVar44;
            bVar20 = (bool)((byte)(uVar59 >> 1) & 1);
            auVar71._4_4_ = (uint)bVar20 * auVar61._4_4_ | !bVar20 * uVar44;
            bVar20 = (bool)((byte)(uVar59 >> 2) & 1);
            auVar71._8_4_ = (uint)bVar20 * auVar61._8_4_ | !bVar20 * uVar44;
            bVar20 = SUB81(uVar59 >> 3,0);
            auVar71._12_4_ = (uint)bVar20 * auVar61._12_4_ | !bVar20 * uVar44;
            auVar61 = vmovdqa32_avx512vl(auVar87);
            bVar20 = (bool)((byte)uVar59 & 1);
            auVar72._0_4_ = (uint)bVar20 * auVar61._0_4_ | (uint)!bVar20 * auVar124._0_4_;
            bVar20 = (bool)((byte)(uVar59 >> 1) & 1);
            auVar72._4_4_ = (uint)bVar20 * auVar61._4_4_ | (uint)!bVar20 * auVar124._4_4_;
            bVar20 = (bool)((byte)(uVar59 >> 2) & 1);
            auVar72._8_4_ = (uint)bVar20 * auVar61._8_4_ | (uint)!bVar20 * auVar124._8_4_;
            bVar20 = SUB81(uVar59 >> 3,0);
            auVar72._12_4_ = (uint)bVar20 * auVar61._12_4_ | (uint)!bVar20 * auVar124._12_4_;
            auVar147 = ZEXT1664(auVar77);
            auVar61 = vpshufd_avx(auVar72,0xaa);
            auVar62 = vpshufd_avx(auVar70,0xaa);
            uVar59 = vpcmpgtd_avx512vl(auVar61,auVar62);
            uVar59 = uVar59 & 0xf;
            auVar62 = vpblendmd_avx512vl(auVar72,auVar70);
            bVar20 = (bool)((byte)uVar59 & 1);
            auVar73._0_4_ = (uint)bVar20 * auVar62._0_4_ | (uint)!bVar20 * auVar61._0_4_;
            bVar20 = (bool)((byte)(uVar59 >> 1) & 1);
            auVar73._4_4_ = (uint)bVar20 * auVar62._4_4_ | (uint)!bVar20 * auVar61._4_4_;
            bVar20 = (bool)((byte)(uVar59 >> 2) & 1);
            auVar73._8_4_ = (uint)bVar20 * auVar62._8_4_ | (uint)!bVar20 * auVar61._8_4_;
            bVar20 = SUB81(uVar59 >> 3,0);
            auVar73._12_4_ = (uint)bVar20 * auVar62._12_4_ | (uint)!bVar20 * auVar61._12_4_;
            auVar63 = vmovdqa32_avx512vl(auVar72);
            bVar20 = (bool)((byte)uVar59 & 1);
            bVar22 = (bool)((byte)(uVar59 >> 1) & 1);
            bVar23 = (bool)((byte)(uVar59 >> 2) & 1);
            bVar25 = SUB81(uVar59 >> 3,0);
            auVar61 = vpshufd_avx(auVar71,0xaa);
            auVar62 = vpshufd_avx(auVar69,0xaa);
            uVar41 = vpcmpgtd_avx512vl(auVar61,auVar62);
            uVar41 = uVar41 & 0xf;
            auVar62 = vpblendmd_avx512vl(auVar71,auVar69);
            bVar21 = (bool)((byte)uVar41 & 1);
            bVar24 = (bool)((byte)(uVar41 >> 1) & 1);
            uVar59 = CONCAT44((uint)bVar24 * auVar62._4_4_ | (uint)!bVar24 * auVar61._4_4_,
                              (uint)bVar21 * auVar62._0_4_ | (uint)!bVar21 * auVar61._0_4_);
            auVar61 = vmovdqa32_avx512vl(auVar71);
            bVar21 = (bool)((byte)uVar41 & 1);
            auVar74._0_4_ = (uint)bVar21 * auVar61._0_4_ | !bVar21 * auVar69._0_4_;
            bVar21 = (bool)((byte)(uVar41 >> 1) & 1);
            auVar74._4_4_ = (uint)bVar21 * auVar61._4_4_ | !bVar21 * auVar69._4_4_;
            bVar21 = (bool)((byte)(uVar41 >> 2) & 1);
            auVar74._8_4_ = (uint)bVar21 * auVar61._8_4_ | !bVar21 * auVar69._8_4_;
            bVar21 = SUB81(uVar41 >> 3,0);
            auVar74._12_4_ = (uint)bVar21 * auVar61._12_4_ | !bVar21 * auVar69._12_4_;
            auVar61 = vpshufd_avx(auVar74,0xaa);
            auVar62 = vpshufd_avx(auVar73,0xaa);
            uVar41 = vpcmpgtd_avx512vl(auVar62,auVar61);
            uVar41 = uVar41 & 0xf;
            auVar62 = vpblendmd_avx512vl(auVar73,auVar74);
            bVar21 = (bool)((byte)uVar41 & 1);
            auVar75._0_4_ = (uint)bVar21 * auVar62._0_4_ | (uint)!bVar21 * auVar61._0_4_;
            bVar21 = (bool)((byte)(uVar41 >> 1) & 1);
            auVar75._4_4_ = (uint)bVar21 * auVar62._4_4_ | (uint)!bVar21 * auVar61._4_4_;
            bVar21 = (bool)((byte)(uVar41 >> 2) & 1);
            auVar75._8_4_ = (uint)bVar21 * auVar62._8_4_ | (uint)!bVar21 * auVar61._8_4_;
            bVar21 = SUB81(uVar41 >> 3,0);
            auVar75._12_4_ = (uint)bVar21 * auVar62._12_4_ | (uint)!bVar21 * auVar61._12_4_;
            auVar61 = vmovdqa32_avx512vl(auVar73);
            bVar21 = (bool)((byte)uVar41 & 1);
            auVar76._0_4_ = (uint)bVar21 * auVar61._0_4_ | !bVar21 * auVar74._0_4_;
            bVar21 = (bool)((byte)(uVar41 >> 1) & 1);
            auVar76._4_4_ = (uint)bVar21 * auVar61._4_4_ | !bVar21 * auVar74._4_4_;
            bVar21 = (bool)((byte)(uVar41 >> 2) & 1);
            auVar76._8_4_ = (uint)bVar21 * auVar61._8_4_ | !bVar21 * auVar74._8_4_;
            bVar21 = SUB81(uVar41 >> 3,0);
            auVar76._12_4_ = (uint)bVar21 * auVar61._12_4_ | !bVar21 * auVar74._12_4_;
            *(uint *)puVar51 = (uint)bVar20 * auVar63._0_4_ | !bVar20 * auVar70._0_4_;
            *(uint *)((long)puVar51 + 4) = (uint)bVar22 * auVar63._4_4_ | !bVar22 * auVar70._4_4_;
            *(uint *)(puVar51 + 1) = (uint)bVar23 * auVar63._8_4_ | !bVar23 * auVar70._8_4_;
            *(uint *)((long)puVar51 + 0xc) =
                 (uint)bVar25 * auVar63._12_4_ | !bVar25 * auVar70._12_4_;
            *(undefined1 (*) [16])(puVar51 + 2) = auVar76;
            *(undefined1 (*) [16])(puVar51 + 4) = auVar75;
            puVar51 = puVar51 + 6;
          }
          auVar143 = ZEXT1664(auVar78);
        }
      }
    }
    local_1450 = (ulong)((uint)uVar59 & 0xf) - 8;
    uVar59 = uVar59 & 0xfffffffffffffff0;
    local_1448 = 0;
    local_1280 = vmovdqa64_avx512vl(auVar169._0_16_);
    local_1408 = uVar59;
    local_1400 = puVar51;
    for (; local_1448 != local_1450; local_1448 = local_1448 + 1) {
      lVar42 = local_1448 * 0x90;
      local_13f8 = uVar59 + lVar42;
      fVar135 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(uVar59 + 0x80 + lVar42)) *
                *(float *)(uVar59 + 0x84 + lVar42);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = *(ulong *)(uVar59 + 0x20 + lVar42);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = *(ulong *)(uVar59 + 0x24 + lVar42);
      uVar28 = vpcmpub_avx512vl(auVar61,auVar64,2);
      auVar61 = vpmovzxbd_avx(auVar61);
      auVar61 = vcvtdq2ps_avx(auVar61);
      uVar8 = *(undefined4 *)(uVar59 + 0x44 + lVar42);
      auVar82._4_4_ = uVar8;
      auVar82._0_4_ = uVar8;
      auVar82._8_4_ = uVar8;
      auVar82._12_4_ = uVar8;
      uVar8 = *(undefined4 *)(uVar59 + 0x38 + lVar42);
      auVar84._4_4_ = uVar8;
      auVar84._0_4_ = uVar8;
      auVar84._8_4_ = uVar8;
      auVar84._12_4_ = uVar8;
      auVar62 = vfmadd213ps_fma(auVar61,auVar82,auVar84);
      auVar63._8_8_ = 0;
      auVar63._0_8_ = *(ulong *)(uVar59 + 0x50 + lVar42);
      auVar61 = vpmovzxbd_avx(auVar63);
      auVar61 = vcvtdq2ps_avx(auVar61);
      uVar8 = *(undefined4 *)(uVar59 + 0x74 + lVar42);
      auVar145._4_4_ = uVar8;
      auVar145._0_4_ = uVar8;
      auVar145._8_4_ = uVar8;
      auVar145._12_4_ = uVar8;
      uVar8 = *(undefined4 *)(uVar59 + 0x68 + lVar42);
      auVar148._4_4_ = uVar8;
      auVar148._0_4_ = uVar8;
      auVar148._8_4_ = uVar8;
      auVar148._12_4_ = uVar8;
      auVar61 = vfmadd213ps_fma(auVar61,auVar145,auVar148);
      auVar124._4_4_ = fVar135;
      auVar124._0_4_ = fVar135;
      auVar124._8_4_ = fVar135;
      auVar124._12_4_ = fVar135;
      auVar61 = vsubps_avx(auVar61,auVar62);
      auVar62 = vfmadd213ps_fma(auVar61,auVar124,auVar62);
      auVar61 = vpmovzxbd_avx(auVar64);
      auVar61 = vcvtdq2ps_avx(auVar61);
      auVar63 = vfmadd213ps_fma(auVar61,auVar82,auVar84);
      auVar78._8_8_ = 0;
      auVar78._0_8_ = *(ulong *)(uVar59 + 0x54 + lVar42);
      auVar61 = vpmovzxbd_avx(auVar78);
      auVar61 = vcvtdq2ps_avx(auVar61);
      auVar61 = vfmadd213ps_fma(auVar61,auVar145,auVar148);
      auVar61 = vsubps_avx(auVar61,auVar63);
      auVar63 = vfmadd213ps_fma(auVar61,auVar124,auVar63);
      auVar77._8_8_ = 0;
      auVar77._0_8_ = *(ulong *)(uVar59 + 0x28 + lVar42);
      auVar61 = vpmovzxbd_avx(auVar77);
      auVar61 = vcvtdq2ps_avx(auVar61);
      uVar8 = *(undefined4 *)(uVar59 + 0x48 + lVar42);
      auVar83._4_4_ = uVar8;
      auVar83._0_4_ = uVar8;
      auVar83._8_4_ = uVar8;
      auVar83._12_4_ = uVar8;
      uVar8 = *(undefined4 *)(uVar59 + 0x3c + lVar42);
      auVar85._4_4_ = uVar8;
      auVar85._0_4_ = uVar8;
      auVar85._8_4_ = uVar8;
      auVar85._12_4_ = uVar8;
      auVar64 = vfmadd213ps_fma(auVar61,auVar83,auVar85);
      auVar146._8_8_ = 0;
      auVar146._0_8_ = *(ulong *)(uVar59 + 0x58 + lVar42);
      auVar61 = vpmovzxbd_avx(auVar146);
      uVar8 = *(undefined4 *)(uVar59 + 0x78 + lVar42);
      auVar149._4_4_ = uVar8;
      auVar149._0_4_ = uVar8;
      auVar149._8_4_ = uVar8;
      auVar149._12_4_ = uVar8;
      auVar61 = vcvtdq2ps_avx(auVar61);
      uVar8 = *(undefined4 *)(uVar59 + 0x6c + lVar42);
      auVar152._4_4_ = uVar8;
      auVar152._0_4_ = uVar8;
      auVar152._8_4_ = uVar8;
      auVar152._12_4_ = uVar8;
      auVar61 = vfmadd213ps_fma(auVar61,auVar149,auVar152);
      auVar61 = vsubps_avx(auVar61,auVar64);
      auVar64 = vfmadd213ps_fma(auVar61,auVar124,auVar64);
      auVar137._8_8_ = 0;
      auVar137._0_8_ = *(ulong *)(uVar59 + 0x2c + lVar42);
      auVar61 = vpmovzxbd_avx(auVar137);
      auVar61 = vcvtdq2ps_avx(auVar61);
      auVar78 = vfmadd213ps_fma(auVar61,auVar83,auVar85);
      auVar154._8_8_ = 0;
      auVar154._0_8_ = *(ulong *)(uVar59 + 0x5c + lVar42);
      auVar61 = vpmovzxbd_avx(auVar154);
      auVar61 = vcvtdq2ps_avx(auVar61);
      auVar61 = vfmadd213ps_fma(auVar61,auVar149,auVar152);
      auVar61 = vsubps_avx(auVar61,auVar78);
      auVar78 = vfmadd213ps_fma(auVar61,auVar124,auVar78);
      auVar79._8_8_ = 0;
      auVar79._0_8_ = *(ulong *)(uVar59 + 0x30 + lVar42);
      auVar61 = vpmovzxbd_avx(auVar79);
      auVar61 = vcvtdq2ps_avx(auVar61);
      uVar8 = *(undefined4 *)(uVar59 + 0x4c + lVar42);
      auVar86._4_4_ = uVar8;
      auVar86._0_4_ = uVar8;
      auVar86._8_4_ = uVar8;
      auVar86._12_4_ = uVar8;
      uVar8 = *(undefined4 *)(uVar59 + 0x40 + lVar42);
      auVar150._4_4_ = uVar8;
      auVar150._0_4_ = uVar8;
      auVar150._8_4_ = uVar8;
      auVar150._12_4_ = uVar8;
      auVar77 = vfmadd213ps_fma(auVar61,auVar86,auVar150);
      auVar153._8_8_ = 0;
      auVar153._0_8_ = *(ulong *)(uVar59 + 0x60 + lVar42);
      auVar61 = vpmovzxbd_avx(auVar153);
      auVar61 = vcvtdq2ps_avx(auVar61);
      uVar8 = *(undefined4 *)(uVar59 + 0x7c + lVar42);
      auVar155._4_4_ = uVar8;
      auVar155._0_4_ = uVar8;
      auVar155._8_4_ = uVar8;
      auVar155._12_4_ = uVar8;
      uVar8 = *(undefined4 *)(uVar59 + 0x70 + lVar42);
      auVar156._4_4_ = uVar8;
      auVar156._0_4_ = uVar8;
      auVar156._8_4_ = uVar8;
      auVar156._12_4_ = uVar8;
      auVar61 = vfmadd213ps_fma(auVar61,auVar155,auVar156);
      auVar61 = vsubps_avx(auVar61,auVar77);
      auVar77 = vfmadd213ps_fma(auVar61,auVar124,auVar77);
      auVar81._8_8_ = 0;
      auVar81._0_8_ = *(ulong *)(uVar59 + 0x34 + lVar42);
      auVar61 = vpmovzxbd_avx(auVar81);
      auVar61 = vcvtdq2ps_avx(auVar61);
      auVar137 = vfmadd213ps_fma(auVar61,auVar86,auVar150);
      auVar142._8_8_ = 0;
      auVar142._0_8_ = *(ulong *)(uVar59 + 100 + lVar42);
      auVar61 = vpmovzxbd_avx(auVar142);
      auVar61 = vcvtdq2ps_avx(auVar61);
      auVar61 = vfmadd213ps_fma(auVar61,auVar155,auVar156);
      auVar61 = vsubps_avx(auVar61,auVar137);
      auVar137 = vfmadd213ps_fma(auVar61,auVar124,auVar137);
      auVar61 = vsubps_avx(auVar62,auVar147._0_16_);
      auVar87._0_4_ = auVar159._0_4_ * auVar61._0_4_;
      auVar87._4_4_ = auVar159._4_4_ * auVar61._4_4_;
      auVar87._8_4_ = auVar159._8_4_ * auVar61._8_4_;
      auVar87._12_4_ = auVar159._12_4_ * auVar61._12_4_;
      auVar61 = vsubps_avx(auVar64,auVar143._0_16_);
      auVar80._0_4_ = auVar160._0_4_ * auVar61._0_4_;
      auVar80._4_4_ = auVar160._4_4_ * auVar61._4_4_;
      auVar80._8_4_ = auVar160._8_4_ * auVar61._8_4_;
      auVar80._12_4_ = auVar160._12_4_ * auVar61._12_4_;
      auVar61 = vsubps_avx(auVar77,auVar164._0_16_);
      auVar77 = vmulps_avx512vl(auVar162._0_16_,auVar61);
      auVar61 = vsubps_avx(auVar63,auVar147._0_16_);
      auVar63 = vmulps_avx512vl(auVar165._0_16_,auVar61);
      auVar61 = vsubps_avx(auVar78,auVar143._0_16_);
      auVar64 = vmulps_avx512vl(auVar166._0_16_,auVar61);
      auVar61 = vsubps_avx(auVar137,auVar164._0_16_);
      auVar78 = vmulps_avx512vl(auVar167._0_16_,auVar61);
      auVar62 = vpminsd_avx(auVar87,auVar63);
      auVar61 = vpmaxsd_avx(auVar87,auVar63);
      auVar63 = vpminsd_avx(auVar80,auVar64);
      auVar62 = vpmaxsd_avx(auVar62,auVar63);
      auVar63 = vpmaxsd_avx(auVar80,auVar64);
      auVar63 = vpminsd_avx(auVar61,auVar63);
      auVar64 = vpminsd_avx(auVar77,auVar78);
      auVar61 = vpmaxsd_avx(auVar77,auVar78);
      auVar64 = vpmaxsd_avx512vl(auVar64,auVar168._0_16_);
      local_1270 = vpmaxsd_avx(auVar62,auVar64);
      auVar61 = vpminsd_avx512vl(auVar61,auVar169._0_16_);
      auVar61 = vpminsd_avx(auVar63,auVar61);
      uVar29 = vpcmpd_avx512vl(local_1270,auVar61,2);
      local_13d8 = CONCAT44((int)((ulong)local_13f8 >> 0x20),
                            (uint)((byte)uVar28 & 0xf & (byte)uVar29));
      while (pRVar39 = local_1410, sVar38 = local_1458, local_13d8 != 0) {
        lVar42 = 0;
        for (uVar41 = local_13d8; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
          lVar42 = lVar42 + 1;
        }
        local_13d8 = local_13d8 - 1 & local_13d8;
        fVar135 = *(float *)(ray + k * 4 + 0x100);
        if (*(float *)(local_1270 + lVar42 * 4) <= fVar135) {
          uVar12 = *(ushort *)(local_13f8 + lVar42 * 8);
          local_1474 = (uint)uVar12;
          uVar13 = *(ushort *)(local_13f8 + 2 + lVar42 * 8);
          uVar44 = *(uint *)(local_13f8 + 0x88);
          uVar46 = *(uint *)(local_13f8 + 4 + lVar42 * 8);
          local_1460 = (ulong)uVar46;
          local_13e0 = context->scene;
          pGVar14 = (local_13e0->geometries).items[uVar44].ptr;
          local_13e8 = *(long *)&pGVar14->field_0x58;
          BVar11 = pGVar14->time_range;
          auVar62._8_8_ = 0;
          auVar62._0_4_ = BVar11.lower;
          auVar62._4_4_ = BVar11.upper;
          fVar132 = BVar11.lower;
          auVar112._4_4_ = fVar132;
          auVar112._0_4_ = fVar132;
          auVar112._8_4_ = fVar132;
          auVar112._12_4_ = fVar132;
          auVar112._16_4_ = fVar132;
          auVar112._20_4_ = fVar132;
          auVar112._24_4_ = fVar132;
          auVar112._28_4_ = fVar132;
          fVar132 = pGVar14->fnumTimeSegments;
          auVar112 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar112);
          auVar61 = vmovshdup_avx(auVar62);
          auVar61 = vsubps_avx(auVar61,auVar62);
          auVar92._0_4_ = auVar61._0_4_;
          auVar92._4_4_ = auVar92._0_4_;
          auVar92._8_4_ = auVar92._0_4_;
          auVar92._12_4_ = auVar92._0_4_;
          auVar92._16_4_ = auVar92._0_4_;
          auVar92._20_4_ = auVar92._0_4_;
          auVar92._24_4_ = auVar92._0_4_;
          auVar92._28_4_ = auVar92._0_4_;
          auVar112 = vdivps_avx(auVar112,auVar92);
          auVar109._4_4_ = fVar132 * auVar112._4_4_;
          auVar109._0_4_ = fVar132 * auVar112._0_4_;
          auVar109._8_4_ = fVar132 * auVar112._8_4_;
          auVar109._12_4_ = fVar132 * auVar112._12_4_;
          auVar109._16_4_ = fVar132 * auVar112._16_4_;
          auVar109._20_4_ = fVar132 * auVar112._20_4_;
          auVar109._24_4_ = fVar132 * auVar112._24_4_;
          auVar109._28_4_ = auVar112._28_4_;
          auVar112 = vroundps_avx(auVar109,1);
          fVar132 = fVar132 + -1.0;
          auVar91._4_4_ = fVar132;
          auVar91._0_4_ = fVar132;
          auVar91._8_4_ = fVar132;
          auVar91._12_4_ = fVar132;
          auVar91._16_4_ = fVar132;
          auVar91._20_4_ = fVar132;
          auVar91._24_4_ = fVar132;
          auVar91._28_4_ = fVar132;
          auVar112 = vminps_avx(auVar112,auVar91);
          auVar112 = vmaxps_avx(auVar112,_DAT_01f7b000);
          local_10e0 = vsubps_avx(auVar109,auVar112);
          local_1100 = vcvtps2dq_avx(auVar112);
          local_13f0 = pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
                       * local_1460;
          local_1478 = local_1474 & 0x7fff;
          local_147c = uVar13 & 0x7fff;
          uVar45 = *(uint *)(local_13e8 + 4 + local_13f0);
          uVar54 = (ulong)uVar45;
          uVar53 = (ulong)(uVar45 * local_147c + *(int *)(local_13e8 + local_13f0) + local_1478);
          lVar15 = *(long *)&pGVar14[2].numPrimitives;
          lVar57 = (long)*(int *)(local_1100 + local_1458 * 4) * 0x38;
          lVar16 = *(long *)(lVar15 + 0x10 + lVar57);
          lVar17 = *(long *)(lVar15 + lVar57);
          auVar61 = *(undefined1 (*) [16])(lVar17 + lVar16 * uVar53);
          lVar18 = *(long *)(lVar15 + 0x48 + lVar57);
          auVar62 = *(undefined1 (*) [16])(lVar17 + (uVar53 + 1) * lVar16);
          lVar42 = uVar53 + uVar54;
          auVar63 = *(undefined1 (*) [16])(lVar17 + lVar42 * lVar16);
          lVar50 = uVar53 + uVar54 + 1;
          auVar64 = *(undefined1 (*) [16])(lVar17 + lVar50 * lVar16);
          uVar52 = (ulong)(-1 < (short)uVar12);
          lVar43 = uVar53 + uVar52 + 1;
          auVar78 = *(undefined1 (*) [16])(lVar17 + lVar43 * lVar16);
          lVar49 = uVar52 + lVar50;
          auVar77 = *(undefined1 (*) [16])(lVar17 + lVar49 * lVar16);
          uVar52 = 0;
          if (-1 < (short)uVar13) {
            uVar52 = uVar54;
          }
          auVar137 = *(undefined1 (*) [16])(lVar17 + (lVar42 + uVar52) * lVar16);
          auVar124 = *(undefined1 (*) [16])(lVar17 + (lVar50 + uVar52) * lVar16);
          auVar87 = *(undefined1 (*) [16])(lVar17 + lVar16 * (uVar52 + lVar49));
          lVar15 = *(long *)(lVar15 + 0x38 + lVar57);
          auVar79 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_10e0 + local_1458 * 4)));
          auVar80 = vsubps_avx(*(undefined1 (*) [16])(lVar15 + lVar18 * uVar53),auVar61);
          auVar80 = vfmadd213ps_avx512vl(auVar80,auVar79,auVar61);
          auVar61 = vsubps_avx(*(undefined1 (*) [16])(lVar15 + lVar18 * (uVar53 + 1)),auVar62);
          auVar81 = vfmadd213ps_avx512vl(auVar61,auVar79,auVar62);
          auVar61 = vsubps_avx(*(undefined1 (*) [16])(lVar15 + lVar18 * lVar42),auVar63);
          auVar82 = vfmadd213ps_avx512vl(auVar61,auVar79,auVar63);
          auVar61 = vsubps_avx(*(undefined1 (*) [16])(lVar15 + lVar18 * lVar50),auVar64);
          auVar83 = vfmadd213ps_avx512vl(auVar61,auVar79,auVar64);
          auVar61 = vsubps_avx(*(undefined1 (*) [16])(lVar15 + lVar18 * lVar43),auVar78);
          auVar62 = vfmadd213ps_avx512vl(auVar61,auVar79,auVar78);
          auVar61 = vsubps_avx(*(undefined1 (*) [16])(lVar15 + lVar18 * lVar49),auVar77);
          auVar84 = vfmadd213ps_avx512vl(auVar61,auVar79,auVar77);
          auVar61 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar15 + lVar18 * (lVar42 + uVar52)),
                                    auVar137);
          auVar85 = vfmadd213ps_avx512vl(auVar61,auVar79,auVar137);
          auVar61 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar15 + lVar18 * (lVar50 + uVar52)),
                                    auVar124);
          auVar86 = vfmadd213ps_avx512vl(auVar61,auVar79,auVar124);
          auVar61 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar15 + (uVar52 + lVar49) * lVar18),
                                    auVar87);
          auVar87 = vfmadd213ps_avx512vl(auVar61,auVar79,auVar87);
          auVar63 = vunpcklps_avx(auVar81,auVar84);
          auVar61 = vunpckhps_avx(auVar81,auVar84);
          auVar64 = vunpcklps_avx(auVar62,auVar83);
          auVar62 = vunpckhps_avx(auVar62,auVar83);
          auVar78 = vunpcklps_avx(auVar61,auVar62);
          auVar77 = vunpcklps_avx(auVar63,auVar64);
          auVar61 = vunpckhps_avx(auVar63,auVar64);
          auVar64 = vunpcklps_avx(auVar82,auVar86);
          auVar62 = vunpckhps_avx(auVar82,auVar86);
          auVar137 = vunpcklps_avx(auVar83,auVar85);
          auVar63 = vunpckhps_avx(auVar83,auVar85);
          auVar63 = vunpcklps_avx(auVar62,auVar63);
          auVar124 = vunpcklps_avx(auVar64,auVar137);
          auVar62 = vunpckhps_avx(auVar64,auVar137);
          auVar96._16_16_ = auVar86;
          auVar96._0_16_ = auVar82;
          auVar94._16_16_ = auVar84;
          auVar94._0_16_ = auVar81;
          auVar112 = vunpcklps_avx(auVar94,auVar96);
          auVar101._16_16_ = auVar83;
          auVar101._0_16_ = auVar80;
          auVar98._16_16_ = auVar87;
          auVar98._0_16_ = auVar83;
          auVar109 = vunpcklps_avx(auVar101,auVar98);
          auVar91 = vunpcklps_avx(auVar109,auVar112);
          auVar109 = vunpckhps_avx(auVar109,auVar112);
          auVar112 = vunpckhps_avx(auVar94,auVar96);
          auVar92 = vunpckhps_avx(auVar101,auVar98);
          auVar92 = vunpcklps_avx(auVar92,auVar112);
          auVar97._16_16_ = auVar77;
          auVar97._0_16_ = auVar77;
          auVar99._16_16_ = auVar61;
          auVar99._0_16_ = auVar61;
          auVar100._16_16_ = auVar78;
          auVar100._0_16_ = auVar78;
          auVar102._16_16_ = auVar124;
          auVar102._0_16_ = auVar124;
          auVar103._16_16_ = auVar62;
          auVar103._0_16_ = auVar62;
          uVar8 = *(undefined4 *)(local_1410 + local_1458 * 4);
          auVar104._4_4_ = uVar8;
          auVar104._0_4_ = uVar8;
          auVar104._8_4_ = uVar8;
          auVar104._12_4_ = uVar8;
          auVar104._16_4_ = uVar8;
          auVar104._20_4_ = uVar8;
          auVar104._24_4_ = uVar8;
          auVar104._28_4_ = uVar8;
          auVar88 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_1410 + local_1458 * 4 + 0x20)));
          auVar89 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_1410 + local_1458 * 4 + 0x40)));
          uVar8 = *(undefined4 *)(local_1410 + local_1458 * 4 + 0x80);
          auVar151._4_4_ = uVar8;
          auVar151._0_4_ = uVar8;
          auVar151._8_4_ = uVar8;
          auVar151._12_4_ = uVar8;
          auVar151._16_4_ = uVar8;
          auVar151._20_4_ = uVar8;
          auVar151._24_4_ = uVar8;
          auVar151._28_4_ = uVar8;
          auVar90 = vinsertf32x4_avx512vl(ZEXT1632(auVar63),auVar63,1);
          uVar8 = *(undefined4 *)(local_1410 + local_1458 * 4 + 0xa0);
          auVar157._4_4_ = uVar8;
          auVar157._0_4_ = uVar8;
          auVar157._8_4_ = uVar8;
          auVar157._12_4_ = uVar8;
          auVar157._16_4_ = uVar8;
          auVar157._20_4_ = uVar8;
          auVar157._24_4_ = uVar8;
          auVar157._28_4_ = uVar8;
          fVar132 = *(float *)(local_1410 + local_1458 * 4 + 0xc0);
          auVar161._4_4_ = fVar132;
          auVar161._0_4_ = fVar132;
          auVar161._8_4_ = fVar132;
          auVar161._12_4_ = fVar132;
          auVar161._16_4_ = fVar132;
          auVar161._20_4_ = fVar132;
          auVar161._24_4_ = fVar132;
          auVar161._28_4_ = fVar132;
          auVar112 = vsubps_avx(auVar91,auVar104);
          auVar91 = vsubps_avx512vl(auVar109,auVar88);
          auVar92 = vsubps_avx512vl(auVar92,auVar89);
          auVar109 = vsubps_avx(auVar97,auVar104);
          auVar93 = vsubps_avx512vl(auVar99,auVar88);
          auVar94 = vsubps_avx512vl(auVar100,auVar89);
          auVar95 = vsubps_avx512vl(auVar102,auVar104);
          auVar88 = vsubps_avx512vl(auVar103,auVar88);
          auVar89 = vsubps_avx512vl(auVar90,auVar89);
          auVar96 = vsubps_avx512vl(auVar95,auVar112);
          auVar97 = vsubps_avx512vl(auVar88,auVar91);
          auVar98 = vsubps_avx512vl(auVar89,auVar92);
          auVar99 = vsubps_avx512vl(auVar112,auVar109);
          auVar100 = vsubps_avx512vl(auVar91,auVar93);
          auVar101 = vsubps_avx512vl(auVar92,auVar94);
          auVar102 = vsubps_avx512vl(auVar109,auVar95);
          auVar103 = vsubps_avx512vl(auVar93,auVar88);
          auVar104 = vsubps_avx512vl(auVar94,auVar89);
          auVar90 = vaddps_avx512vl(auVar95,auVar112);
          auVar105 = vaddps_avx512vl(auVar88,auVar91);
          auVar106 = vaddps_avx512vl(auVar89,auVar92);
          auVar107 = vmulps_avx512vl(auVar105,auVar98);
          auVar107 = vfmsub231ps_avx512vl(auVar107,auVar97,auVar106);
          auVar106 = vmulps_avx512vl(auVar106,auVar96);
          auVar106 = vfmsub231ps_avx512vl(auVar106,auVar98,auVar90);
          auVar90 = vmulps_avx512vl(auVar90,auVar97);
          auVar61 = vfmsub231ps_fma(auVar90,auVar96,auVar105);
          auVar108._0_4_ = auVar61._0_4_ * fVar132;
          auVar108._4_4_ = auVar61._4_4_ * fVar132;
          auVar108._8_4_ = auVar61._8_4_ * fVar132;
          auVar108._12_4_ = auVar61._12_4_ * fVar132;
          auVar108._16_4_ = fVar132 * 0.0;
          auVar108._20_4_ = fVar132 * 0.0;
          auVar108._24_4_ = fVar132 * 0.0;
          auVar108._28_4_ = 0;
          auVar90 = vfmadd231ps_avx512vl(auVar108,auVar157,auVar106);
          auVar106 = vfmadd231ps_avx512vl(auVar90,auVar151,auVar107);
          auVar163._0_4_ = auVar112._0_4_ + auVar109._0_4_;
          auVar163._4_4_ = auVar112._4_4_ + auVar109._4_4_;
          auVar163._8_4_ = auVar112._8_4_ + auVar109._8_4_;
          auVar163._12_4_ = auVar112._12_4_ + auVar109._12_4_;
          auVar163._16_4_ = auVar112._16_4_ + auVar109._16_4_;
          auVar163._20_4_ = auVar112._20_4_ + auVar109._20_4_;
          auVar163._24_4_ = auVar112._24_4_ + auVar109._24_4_;
          auVar163._28_4_ = auVar112._28_4_ + auVar109._28_4_;
          auVar90 = vaddps_avx512vl(auVar91,auVar93);
          auVar105 = vaddps_avx512vl(auVar92,auVar94);
          auVar107 = vmulps_avx512vl(auVar90,auVar101);
          auVar107 = vfmsub231ps_avx512vl(auVar107,auVar100,auVar105);
          auVar105 = vmulps_avx512vl(auVar105,auVar99);
          auVar108 = vfmsub231ps_avx512vl(auVar105,auVar101,auVar163);
          auVar105 = vmulps_avx512vl(auVar163,auVar100);
          auVar90 = vfmsub231ps_avx512vl(auVar105,auVar99,auVar90);
          auVar105._4_4_ = auVar90._4_4_ * fVar132;
          auVar105._0_4_ = auVar90._0_4_ * fVar132;
          auVar105._8_4_ = auVar90._8_4_ * fVar132;
          auVar105._12_4_ = auVar90._12_4_ * fVar132;
          auVar105._16_4_ = auVar90._16_4_ * fVar132;
          auVar105._20_4_ = auVar90._20_4_ * fVar132;
          auVar105._24_4_ = auVar90._24_4_ * fVar132;
          auVar105._28_4_ = auVar90._28_4_;
          auVar90 = vfmadd231ps_avx512vl(auVar105,auVar157,auVar108);
          auVar105 = vfmadd231ps_avx512vl(auVar90,auVar151,auVar107);
          auVar109 = vaddps_avx512vl(auVar109,auVar95);
          auVar88 = vaddps_avx512vl(auVar93,auVar88);
          auVar89 = vaddps_avx512vl(auVar94,auVar89);
          auVar90 = vmulps_avx512vl(auVar88,auVar104);
          auVar90 = vfmsub231ps_avx512vl(auVar90,auVar103,auVar89);
          auVar89 = vmulps_avx512vl(auVar89,auVar102);
          auVar89 = vfmsub231ps_avx512vl(auVar89,auVar104,auVar109);
          auVar93._4_4_ = auVar109._4_4_ * auVar103._4_4_;
          auVar93._0_4_ = auVar109._0_4_ * auVar103._0_4_;
          auVar93._8_4_ = auVar109._8_4_ * auVar103._8_4_;
          auVar93._12_4_ = auVar109._12_4_ * auVar103._12_4_;
          auVar93._16_4_ = auVar109._16_4_ * auVar103._16_4_;
          auVar93._20_4_ = auVar109._20_4_ * auVar103._20_4_;
          auVar93._24_4_ = auVar109._24_4_ * auVar103._24_4_;
          auVar93._28_4_ = auVar109._28_4_;
          auVar61 = vfmsub231ps_fma(auVar93,auVar102,auVar88);
          auVar109 = vmulps_avx512vl(ZEXT1632(auVar61),auVar161);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar157,auVar89);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar151,auVar90);
          auVar95._0_4_ = auVar106._0_4_ + auVar105._0_4_;
          auVar95._4_4_ = auVar106._4_4_ + auVar105._4_4_;
          auVar95._8_4_ = auVar106._8_4_ + auVar105._8_4_;
          auVar95._12_4_ = auVar106._12_4_ + auVar105._12_4_;
          auVar95._16_4_ = auVar106._16_4_ + auVar105._16_4_;
          auVar95._20_4_ = auVar106._20_4_ + auVar105._20_4_;
          auVar95._24_4_ = auVar106._24_4_ + auVar105._24_4_;
          auVar95._28_4_ = auVar106._28_4_ + auVar105._28_4_;
          local_1220 = vaddps_avx512vl(auVar109,auVar95);
          auVar88._8_4_ = 0x7fffffff;
          auVar88._0_8_ = 0x7fffffff7fffffff;
          auVar88._12_4_ = 0x7fffffff;
          auVar88._16_4_ = 0x7fffffff;
          auVar88._20_4_ = 0x7fffffff;
          auVar88._24_4_ = 0x7fffffff;
          auVar88._28_4_ = 0x7fffffff;
          vandps_avx512vl(local_1220,auVar88);
          auVar89._8_4_ = 0x34000000;
          auVar89._0_8_ = 0x3400000034000000;
          auVar89._12_4_ = 0x34000000;
          auVar89._16_4_ = 0x34000000;
          auVar89._20_4_ = 0x34000000;
          auVar89._24_4_ = 0x34000000;
          auVar89._28_4_ = 0x34000000;
          auVar88 = vmulps_avx512vl(local_1220,auVar89);
          auVar89 = vminps_avx512vl(auVar106,auVar105);
          auVar89 = vminps_avx512vl(auVar89,auVar109);
          auVar90._8_4_ = 0x80000000;
          auVar90._0_8_ = 0x8000000080000000;
          auVar90._12_4_ = 0x80000000;
          auVar90._16_4_ = 0x80000000;
          auVar90._20_4_ = 0x80000000;
          auVar90._24_4_ = 0x80000000;
          auVar90._28_4_ = 0x80000000;
          auVar90 = vxorps_avx512vl(auVar88,auVar90);
          uVar28 = vcmpps_avx512vl(auVar89,auVar90,5);
          auVar89 = vmaxps_avx512vl(auVar106,auVar105);
          auVar109 = vmaxps_avx512vl(auVar89,auVar109);
          uVar29 = vcmpps_avx512vl(auVar109,auVar88,2);
          bVar31 = (byte)uVar28 | (byte)uVar29;
          if (bVar31 != 0) {
            auVar109 = vmulps_avx512vl(auVar100,auVar98);
            auVar88 = vmulps_avx512vl(auVar96,auVar101);
            auVar89 = vmulps_avx512vl(auVar99,auVar97);
            auVar90 = vmulps_avx512vl(auVar103,auVar101);
            auVar93 = vmulps_avx512vl(auVar99,auVar104);
            auVar94 = vmulps_avx512vl(auVar102,auVar100);
            auVar95 = vfmsub213ps_avx512vl(auVar97,auVar101,auVar109);
            auVar97 = vfmsub213ps_avx512vl(auVar98,auVar99,auVar88);
            auVar96 = vfmsub213ps_avx512vl(auVar96,auVar100,auVar89);
            auVar98 = vfmsub213ps_avx512vl(auVar104,auVar100,auVar90);
            auVar100 = vfmsub213ps_avx512vl(auVar102,auVar101,auVar93);
            auVar99 = vfmsub213ps_avx512vl(auVar103,auVar99,auVar94);
            auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar109,auVar101);
            vandps_avx512vl(auVar90,auVar101);
            uVar52 = vcmpps_avx512vl(auVar101,auVar101,1);
            vandps_avx512vl(auVar88,auVar101);
            vandps_avx512vl(auVar93,auVar101);
            uVar53 = vcmpps_avx512vl(auVar101,auVar101,1);
            vandps_avx512vl(auVar89,auVar101);
            vandps_avx512vl(auVar94,auVar101);
            uVar54 = vcmpps_avx512vl(auVar101,auVar101,1);
            bVar20 = (bool)((byte)uVar52 & 1);
            auVar110._0_4_ = (float)((uint)bVar20 * auVar95._0_4_ | (uint)!bVar20 * auVar98._0_4_);
            bVar20 = (bool)((byte)(uVar52 >> 1) & 1);
            auVar110._4_4_ = (float)((uint)bVar20 * auVar95._4_4_ | (uint)!bVar20 * auVar98._4_4_);
            bVar20 = (bool)((byte)(uVar52 >> 2) & 1);
            auVar110._8_4_ = (float)((uint)bVar20 * auVar95._8_4_ | (uint)!bVar20 * auVar98._8_4_);
            bVar20 = (bool)((byte)(uVar52 >> 3) & 1);
            auVar110._12_4_ =
                 (float)((uint)bVar20 * auVar95._12_4_ | (uint)!bVar20 * auVar98._12_4_);
            bVar20 = (bool)((byte)(uVar52 >> 4) & 1);
            auVar110._16_4_ =
                 (float)((uint)bVar20 * auVar95._16_4_ | (uint)!bVar20 * auVar98._16_4_);
            bVar20 = (bool)((byte)(uVar52 >> 5) & 1);
            auVar110._20_4_ =
                 (float)((uint)bVar20 * auVar95._20_4_ | (uint)!bVar20 * auVar98._20_4_);
            bVar20 = (bool)((byte)(uVar52 >> 6) & 1);
            auVar110._24_4_ =
                 (float)((uint)bVar20 * auVar95._24_4_ | (uint)!bVar20 * auVar98._24_4_);
            bVar20 = SUB81(uVar52 >> 7,0);
            auVar110._28_4_ = (uint)bVar20 * auVar95._28_4_ | (uint)!bVar20 * auVar98._28_4_;
            bVar20 = (bool)((byte)uVar53 & 1);
            auVar111._0_4_ = (float)((uint)bVar20 * auVar97._0_4_ | (uint)!bVar20 * auVar100._0_4_);
            bVar20 = (bool)((byte)(uVar53 >> 1) & 1);
            auVar111._4_4_ = (float)((uint)bVar20 * auVar97._4_4_ | (uint)!bVar20 * auVar100._4_4_);
            bVar20 = (bool)((byte)(uVar53 >> 2) & 1);
            auVar111._8_4_ = (float)((uint)bVar20 * auVar97._8_4_ | (uint)!bVar20 * auVar100._8_4_);
            bVar20 = (bool)((byte)(uVar53 >> 3) & 1);
            auVar111._12_4_ =
                 (float)((uint)bVar20 * auVar97._12_4_ | (uint)!bVar20 * auVar100._12_4_);
            bVar20 = (bool)((byte)(uVar53 >> 4) & 1);
            auVar111._16_4_ =
                 (float)((uint)bVar20 * auVar97._16_4_ | (uint)!bVar20 * auVar100._16_4_);
            bVar20 = (bool)((byte)(uVar53 >> 5) & 1);
            auVar111._20_4_ =
                 (float)((uint)bVar20 * auVar97._20_4_ | (uint)!bVar20 * auVar100._20_4_);
            bVar20 = (bool)((byte)(uVar53 >> 6) & 1);
            auVar111._24_4_ =
                 (float)((uint)bVar20 * auVar97._24_4_ | (uint)!bVar20 * auVar100._24_4_);
            bVar20 = SUB81(uVar53 >> 7,0);
            auVar111._28_4_ = (uint)bVar20 * auVar97._28_4_ | (uint)!bVar20 * auVar100._28_4_;
            bVar20 = (bool)((byte)uVar54 & 1);
            fVar60 = (float)((uint)bVar20 * auVar96._0_4_ | (uint)!bVar20 * auVar99._0_4_);
            bVar20 = (bool)((byte)(uVar54 >> 1) & 1);
            fVar116 = (float)((uint)bVar20 * auVar96._4_4_ | (uint)!bVar20 * auVar99._4_4_);
            bVar20 = (bool)((byte)(uVar54 >> 2) & 1);
            fVar117 = (float)((uint)bVar20 * auVar96._8_4_ | (uint)!bVar20 * auVar99._8_4_);
            bVar20 = (bool)((byte)(uVar54 >> 3) & 1);
            fVar118 = (float)((uint)bVar20 * auVar96._12_4_ | (uint)!bVar20 * auVar99._12_4_);
            bVar20 = (bool)((byte)(uVar54 >> 4) & 1);
            fVar119 = (float)((uint)bVar20 * auVar96._16_4_ | (uint)!bVar20 * auVar99._16_4_);
            bVar20 = (bool)((byte)(uVar54 >> 5) & 1);
            fVar120 = (float)((uint)bVar20 * auVar96._20_4_ | (uint)!bVar20 * auVar99._20_4_);
            bVar20 = (bool)((byte)(uVar54 >> 6) & 1);
            fVar121 = (float)((uint)bVar20 * auVar96._24_4_ | (uint)!bVar20 * auVar99._24_4_);
            bVar20 = SUB81(uVar54 >> 7,0);
            auVar34._4_4_ = fVar132 * fVar116;
            auVar34._0_4_ = fVar132 * fVar60;
            auVar34._8_4_ = fVar132 * fVar117;
            auVar34._12_4_ = fVar132 * fVar118;
            auVar34._16_4_ = fVar132 * fVar119;
            auVar34._20_4_ = fVar132 * fVar120;
            auVar34._24_4_ = fVar132 * fVar121;
            auVar34._28_4_ = fVar132;
            auVar61 = vfmadd213ps_fma(auVar157,auVar111,auVar34);
            auVar61 = vfmadd213ps_fma(auVar151,auVar110,ZEXT1632(auVar61));
            auVar88 = ZEXT1632(CONCAT412(auVar61._12_4_ + auVar61._12_4_,
                                         CONCAT48(auVar61._8_4_ + auVar61._8_4_,
                                                  CONCAT44(auVar61._4_4_ + auVar61._4_4_,
                                                           auVar61._0_4_ + auVar61._0_4_))));
            auVar158._0_4_ = auVar92._0_4_ * fVar60;
            auVar158._4_4_ = auVar92._4_4_ * fVar116;
            auVar158._8_4_ = auVar92._8_4_ * fVar117;
            auVar158._12_4_ = auVar92._12_4_ * fVar118;
            auVar158._16_4_ = auVar92._16_4_ * fVar119;
            auVar158._20_4_ = auVar92._20_4_ * fVar120;
            auVar158._24_4_ = auVar92._24_4_ * fVar121;
            auVar158._28_4_ = 0;
            auVar61 = vfmadd213ps_fma(auVar91,auVar111,auVar158);
            auVar62 = vfmadd213ps_fma(auVar112,auVar110,ZEXT1632(auVar61));
            auVar112 = vrcp14ps_avx512vl(auVar88);
            auVar107._8_4_ = 0x3f800000;
            auVar107._0_8_ = 0x3f8000003f800000;
            auVar107._12_4_ = 0x3f800000;
            auVar107._16_4_ = 0x3f800000;
            auVar107._20_4_ = 0x3f800000;
            auVar107._24_4_ = 0x3f800000;
            auVar107._28_4_ = 0x3f800000;
            auVar109 = vfnmadd213ps_avx512vl(auVar112,auVar88,auVar107);
            auVar61 = vfmadd132ps_fma(auVar109,auVar112,auVar112);
            local_13a0._28_4_ = auVar112._28_4_;
            local_13a0._0_28_ =
                 ZEXT1628(CONCAT412(auVar61._12_4_ * (auVar62._12_4_ + auVar62._12_4_),
                                    CONCAT48(auVar61._8_4_ * (auVar62._8_4_ + auVar62._8_4_),
                                             CONCAT44(auVar61._4_4_ *
                                                      (auVar62._4_4_ + auVar62._4_4_),
                                                      auVar61._0_4_ *
                                                      (auVar62._0_4_ + auVar62._0_4_)))));
            auVar143 = ZEXT3264(local_13a0);
            auVar125._4_4_ = fVar135;
            auVar125._0_4_ = fVar135;
            auVar125._8_4_ = fVar135;
            auVar125._12_4_ = fVar135;
            auVar125._16_4_ = fVar135;
            auVar125._20_4_ = fVar135;
            auVar125._24_4_ = fVar135;
            auVar125._28_4_ = fVar135;
            uVar28 = vcmpps_avx512vl(local_13a0,auVar125,2);
            uVar8 = *(undefined4 *)(local_1410 + local_1458 * 4 + 0x60);
            auVar33._4_4_ = uVar8;
            auVar33._0_4_ = uVar8;
            auVar33._8_4_ = uVar8;
            auVar33._12_4_ = uVar8;
            auVar33._16_4_ = uVar8;
            auVar33._20_4_ = uVar8;
            auVar33._24_4_ = uVar8;
            auVar33._28_4_ = uVar8;
            uVar29 = vcmpps_avx512vl(local_13a0,auVar33,0xd);
            bVar31 = (byte)uVar28 & (byte)uVar29 & bVar31;
            if (bVar31 != 0) {
              uVar52 = vcmpps_avx512vl(auVar88,_DAT_01f7b000,4);
              uVar52 = bVar31 & uVar52;
              local_11f8 = (byte)uVar52;
              if (local_11f8 != 0) {
                local_1200 = &local_147d;
                local_11a0 = local_13a0;
                auVar112 = vsubps_avx(local_1220,auVar105);
                auVar112 = vblendps_avx(auVar106,auVar112,0xf0);
                auVar109 = vsubps_avx(local_1220,auVar106);
                local_1240 = vblendps_avx(auVar105,auVar109,0xf0);
                local_1180[0] = auVar110._0_4_ * 1.0;
                local_1180[1] = auVar110._4_4_ * 1.0;
                local_1180[2] = auVar110._8_4_ * 1.0;
                local_1180[3] = auVar110._12_4_ * 1.0;
                fStack_1170 = auVar110._16_4_ * -1.0;
                fStack_116c = auVar110._20_4_ * -1.0;
                fStack_1168 = auVar110._24_4_ * -1.0;
                uStack_1164 = auVar110._28_4_;
                local_1160[0] = auVar111._0_4_ * 1.0;
                local_1160[1] = auVar111._4_4_ * 1.0;
                local_1160[2] = auVar111._8_4_ * 1.0;
                local_1160[3] = auVar111._12_4_ * 1.0;
                fStack_1150 = auVar111._16_4_ * -1.0;
                fStack_114c = auVar111._20_4_ * -1.0;
                fStack_1148 = auVar111._24_4_ * -1.0;
                uStack_1144 = auVar111._28_4_;
                local_1140._4_4_ = fVar116 * 1.0;
                local_1140._0_4_ = fVar60 * 1.0;
                local_1140._8_4_ = fVar117 * 1.0;
                local_1140._12_4_ = fVar118 * 1.0;
                local_1140._16_4_ = fVar119 * -1.0;
                local_1140._20_4_ = fVar120 * -1.0;
                local_1140._24_4_ = fVar121 * -1.0;
                local_1140._28_4_ = (uint)bVar20 * auVar96._28_4_ | (uint)!bVar20 * auVar99._28_4_;
                auVar109 = vpbroadcastd_avx512vl();
                auVar109 = vpaddd_avx2(auVar109,_DAT_01fb7740);
                auVar138._0_4_ = (float)(int)(*(ushort *)(local_13e8 + 8 + local_13f0) - 1);
                auVar138._4_12_ = auVar92._4_12_;
                auVar140._4_12_ = ZEXT812(0) << 0x20;
                auVar140._0_4_ = auVar138._0_4_;
                auVar62 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar140);
                auVar61 = vfnmadd213ss_fma(auVar62,auVar138,ZEXT416(0x40000000));
                fVar135 = auVar62._0_4_ * auVar61._0_4_;
                auVar109 = vcvtdq2ps_avx(auVar109);
                fVar120 = auVar109._28_4_ + auVar112._28_4_;
                fVar132 = (local_1220._0_4_ * auVar109._0_4_ + auVar112._0_4_) * fVar135;
                fVar60 = (local_1220._4_4_ * auVar109._4_4_ + auVar112._4_4_) * fVar135;
                local_1260._4_4_ = fVar60;
                local_1260._0_4_ = fVar132;
                fVar116 = (local_1220._8_4_ * auVar109._8_4_ + auVar112._8_4_) * fVar135;
                local_1260._8_4_ = fVar116;
                fVar117 = (local_1220._12_4_ * auVar109._12_4_ + auVar112._12_4_) * fVar135;
                local_1260._12_4_ = fVar117;
                fVar118 = (local_1220._16_4_ * auVar109._16_4_ + auVar112._16_4_) * fVar135;
                local_1260._16_4_ = fVar118;
                fVar119 = (local_1220._20_4_ * auVar109._20_4_ + auVar112._20_4_) * fVar135;
                local_1260._20_4_ = fVar119;
                fVar135 = (local_1220._24_4_ * auVar109._24_4_ + auVar112._24_4_) * fVar135;
                local_1260._24_4_ = fVar135;
                local_1260._28_4_ = fVar120;
                pGVar14 = (local_13e0->geometries).items[uVar44].ptr;
                if ((pGVar14->mask & *(uint *)(local_1410 + local_1458 * 4 + 0x120)) != 0) {
                  auVar112 = vpbroadcastd_avx512vl();
                  auVar112 = vpaddd_avx2(auVar112,_DAT_01fb7760);
                  auVar112 = vcvtdq2ps_avx(auVar112);
                  auVar139._0_4_ = (float)(int)(*(ushort *)(local_13e8 + 10 + local_13f0) - 1);
                  auVar139._4_12_ = auVar106._4_12_;
                  auVar37._12_4_ = 0;
                  auVar37._0_12_ = ZEXT812(0);
                  auVar62 = vrcp14ss_avx512f(auVar37 << 0x20,ZEXT416((uint)auVar139._0_4_));
                  auVar61 = vfnmadd213ss_fma(auVar62,auVar139,ZEXT416(0x40000000));
                  fVar27 = auVar62._0_4_ * auVar61._0_4_;
                  auVar106._8_4_ = 0x219392ef;
                  auVar106._0_8_ = 0x219392ef219392ef;
                  auVar106._12_4_ = 0x219392ef;
                  auVar106._16_4_ = 0x219392ef;
                  auVar106._20_4_ = 0x219392ef;
                  auVar106._24_4_ = 0x219392ef;
                  auVar106._28_4_ = 0x219392ef;
                  uVar53 = vcmpps_avx512vl(local_1220,auVar106,5);
                  auVar109 = vrcp14ps_avx512vl(local_1220);
                  auVar141._8_4_ = 0x3f800000;
                  auVar141._0_8_ = 0x3f8000003f800000;
                  auVar141._12_4_ = 0x3f800000;
                  auVar141._16_4_ = 0x3f800000;
                  auVar141._20_4_ = 0x3f800000;
                  auVar141._24_4_ = 0x3f800000;
                  auVar141._28_4_ = 0x3f800000;
                  auVar61 = vfnmadd213ps_fma(local_1220,auVar109,auVar141);
                  auVar109 = vfmadd132ps_avx512vl(ZEXT1632(auVar61),auVar109,auVar109);
                  fVar1 = (float)((uint)((byte)uVar53 & 1) * auVar109._0_4_);
                  fVar121 = (float)((uint)((byte)(uVar53 >> 1) & 1) * auVar109._4_4_);
                  fVar2 = (float)((uint)((byte)(uVar53 >> 2) & 1) * auVar109._8_4_);
                  fVar3 = (float)((uint)((byte)(uVar53 >> 3) & 1) * auVar109._12_4_);
                  fVar4 = (float)((uint)((byte)(uVar53 >> 4) & 1) * auVar109._16_4_);
                  fVar5 = (float)((uint)((byte)(uVar53 >> 5) & 1) * auVar109._20_4_);
                  fVar6 = (float)((uint)((byte)(uVar53 >> 6) & 1) * auVar109._24_4_);
                  auVar35._4_4_ = fVar60 * fVar121;
                  auVar35._0_4_ = fVar132 * fVar1;
                  auVar35._8_4_ = fVar116 * fVar2;
                  auVar35._12_4_ = fVar117 * fVar3;
                  auVar35._16_4_ = fVar118 * fVar4;
                  auVar35._20_4_ = fVar119 * fVar5;
                  auVar35._24_4_ = fVar135 * fVar6;
                  auVar35._28_4_ = fVar120;
                  local_11e0 = vminps_avx(auVar35,auVar141);
                  auVar36._4_4_ =
                       (local_1220._4_4_ * auVar112._4_4_ + local_1240._4_4_) * fVar27 * fVar121;
                  auVar36._0_4_ =
                       (local_1220._0_4_ * auVar112._0_4_ + local_1240._0_4_) * fVar27 * fVar1;
                  auVar36._8_4_ =
                       (local_1220._8_4_ * auVar112._8_4_ + local_1240._8_4_) * fVar27 * fVar2;
                  auVar36._12_4_ =
                       (local_1220._12_4_ * auVar112._12_4_ + local_1240._12_4_) * fVar27 * fVar3;
                  auVar36._16_4_ =
                       (local_1220._16_4_ * auVar112._16_4_ + local_1240._16_4_) * fVar27 * fVar4;
                  auVar36._20_4_ =
                       (local_1220._20_4_ * auVar112._20_4_ + local_1240._20_4_) * fVar27 * fVar5;
                  auVar36._24_4_ =
                       (local_1220._24_4_ * auVar112._24_4_ + local_1240._24_4_) * fVar27 * fVar6;
                  auVar36._28_4_ = auVar112._28_4_ + local_1240._28_4_;
                  local_11c0 = vminps_avx(auVar36,auVar141);
                  auVar126._8_4_ = 0x7f800000;
                  auVar126._0_8_ = 0x7f8000007f800000;
                  auVar126._12_4_ = 0x7f800000;
                  auVar126._16_4_ = 0x7f800000;
                  auVar126._20_4_ = 0x7f800000;
                  auVar126._24_4_ = 0x7f800000;
                  auVar126._28_4_ = 0x7f800000;
                  auVar112 = vblendmps_avx512vl(auVar126,local_13a0);
                  auVar113._0_4_ =
                       (uint)(local_11f8 & 1) * auVar112._0_4_ |
                       (uint)!(bool)(local_11f8 & 1) * 0x7f800000;
                  bVar20 = (bool)((byte)(uVar52 >> 1) & 1);
                  auVar113._4_4_ = (uint)bVar20 * auVar112._4_4_ | (uint)!bVar20 * 0x7f800000;
                  bVar20 = (bool)((byte)(uVar52 >> 2) & 1);
                  auVar113._8_4_ = (uint)bVar20 * auVar112._8_4_ | (uint)!bVar20 * 0x7f800000;
                  bVar20 = (bool)((byte)(uVar52 >> 3) & 1);
                  auVar113._12_4_ = (uint)bVar20 * auVar112._12_4_ | (uint)!bVar20 * 0x7f800000;
                  bVar20 = (bool)((byte)(uVar52 >> 4) & 1);
                  auVar113._16_4_ = (uint)bVar20 * auVar112._16_4_ | (uint)!bVar20 * 0x7f800000;
                  bVar20 = (bool)((byte)(uVar52 >> 5) & 1);
                  auVar113._20_4_ = (uint)bVar20 * auVar112._20_4_ | (uint)!bVar20 * 0x7f800000;
                  bVar20 = (bool)((byte)(uVar52 >> 6) & 1);
                  auVar113._24_4_ = (uint)bVar20 * auVar112._24_4_ | (uint)!bVar20 * 0x7f800000;
                  bVar20 = SUB81(uVar52 >> 7,0);
                  auVar113._28_4_ = (uint)bVar20 * auVar112._28_4_ | (uint)!bVar20 * 0x7f800000;
                  auVar112 = vshufps_avx(auVar113,auVar113,0xb1);
                  auVar112 = vminps_avx(auVar113,auVar112);
                  auVar109 = vshufpd_avx(auVar112,auVar112,5);
                  auVar112 = vminps_avx(auVar112,auVar109);
                  auVar109 = vpermpd_avx2(auVar112,0x4e);
                  auVar112 = vminps_avx(auVar112,auVar109);
                  uVar28 = vcmpps_avx512vl(auVar113,auVar112,0);
                  uVar45 = (uint)uVar52;
                  if ((local_11f8 & (byte)uVar28) != 0) {
                    uVar45 = (uint)(local_11f8 & (byte)uVar28);
                  }
                  uVar32 = 0;
                  for (; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x80000000) {
                    uVar32 = uVar32 + 1;
                  }
                  uVar53 = (ulong)uVar32;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar14->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_1360 = vpbroadcastd_avx512vl();
                    local_1380 = vpbroadcastd_avx512vl();
                    local_1470 = ZEXT416(*(uint *)(local_1410 + local_1458 * 4 + 0x100));
                    do {
                      uVar8 = *(undefined4 *)(local_11e0 + uVar53 * 4);
                      local_1060._4_4_ = uVar8;
                      local_1060._0_4_ = uVar8;
                      local_1060._8_4_ = uVar8;
                      local_1060._12_4_ = uVar8;
                      local_1060._16_4_ = uVar8;
                      local_1060._20_4_ = uVar8;
                      local_1060._24_4_ = uVar8;
                      local_1060._28_4_ = uVar8;
                      uVar8 = *(undefined4 *)(local_11c0 + uVar53 * 4);
                      local_1040._4_4_ = uVar8;
                      local_1040._0_4_ = uVar8;
                      local_1040._8_4_ = uVar8;
                      local_1040._12_4_ = uVar8;
                      local_1040._16_4_ = uVar8;
                      local_1040._20_4_ = uVar8;
                      local_1040._24_4_ = uVar8;
                      local_1040._28_4_ = uVar8;
                      *(float *)(pRVar39 + sVar38 * 4 + 0x100) = local_1180[uVar53 - 8];
                      local_13d0.context = context->user;
                      local_10c0 = local_1180[uVar53];
                      fVar135 = local_1160[uVar53];
                      local_10a0._4_4_ = fVar135;
                      local_10a0._0_4_ = fVar135;
                      local_10a0._8_4_ = fVar135;
                      local_10a0._12_4_ = fVar135;
                      local_10a0._16_4_ = fVar135;
                      local_10a0._20_4_ = fVar135;
                      local_10a0._24_4_ = fVar135;
                      local_10a0._28_4_ = fVar135;
                      uVar8 = *(undefined4 *)(local_1140 + uVar53 * 4);
                      local_1080._4_4_ = uVar8;
                      local_1080._0_4_ = uVar8;
                      local_1080._8_4_ = uVar8;
                      local_1080._12_4_ = uVar8;
                      local_1080._16_4_ = uVar8;
                      local_1080._20_4_ = uVar8;
                      local_1080._24_4_ = uVar8;
                      local_1080._28_4_ = uVar8;
                      fStack_10bc = local_10c0;
                      fStack_10b8 = local_10c0;
                      fStack_10b4 = local_10c0;
                      fStack_10b0 = local_10c0;
                      fStack_10ac = local_10c0;
                      fStack_10a8 = local_10c0;
                      fStack_10a4 = local_10c0;
                      local_1020 = local_1380._0_8_;
                      uStack_1018 = local_1380._8_8_;
                      uStack_1010 = local_1380._16_8_;
                      uStack_1008 = local_1380._24_8_;
                      local_1000 = local_1360;
                      vpcmpeqd_avx2(local_1360,local_1360);
                      uStack_fdc = (local_13d0.context)->instID[0];
                      local_fe0 = uStack_fdc;
                      uStack_fd8 = uStack_fdc;
                      uStack_fd4 = uStack_fdc;
                      uStack_fd0 = uStack_fdc;
                      uStack_fcc = uStack_fdc;
                      uStack_fc8 = uStack_fdc;
                      uStack_fc4 = uStack_fdc;
                      uStack_fbc = (local_13d0.context)->instPrimID[0];
                      local_fc0 = uStack_fbc;
                      uStack_fb8 = uStack_fbc;
                      uStack_fb4 = uStack_fbc;
                      uStack_fb0 = uStack_fbc;
                      uStack_fac = uStack_fbc;
                      uStack_fa8 = uStack_fbc;
                      uStack_fa4 = uStack_fbc;
                      local_1340 = local_1120;
                      local_13d0.valid = (int *)local_1340;
                      local_13d0.geometryUserPtr = pGVar14->userPtr;
                      local_13d0.ray = (RTCRayN *)pRVar39;
                      local_13d0.hit = (RTCHitN *)&local_10c0;
                      local_13d0.N = 8;
                      if (pGVar14->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar14->intersectionFilterN)(&local_13d0);
                        auVar143 = ZEXT3264(local_13a0);
                      }
                      if (local_1340 == (undefined1  [32])0x0) {
LAB_01d65907:
                        *(undefined4 *)(pRVar39 + sVar38 * 4 + 0x100) = local_1470._0_4_;
                      }
                      else {
                        p_Var19 = context->args->filter;
                        if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var19)(&local_13d0);
                          auVar143 = ZEXT3264(local_13a0);
                        }
                        if (local_1340 == (undefined1  [32])0x0) goto LAB_01d65907;
                        uVar54 = vptestmd_avx512vl(local_1340,local_1340);
                        fVar135 = *(float *)(local_13d0.hit + 4);
                        fVar132 = *(float *)(local_13d0.hit + 8);
                        fVar60 = *(float *)(local_13d0.hit + 0xc);
                        fVar116 = *(float *)(local_13d0.hit + 0x10);
                        fVar117 = *(float *)(local_13d0.hit + 0x14);
                        fVar118 = *(float *)(local_13d0.hit + 0x18);
                        fVar119 = *(float *)(local_13d0.hit + 0x1c);
                        bVar31 = (byte)uVar54;
                        bVar20 = (bool)((byte)(uVar54 >> 1) & 1);
                        bVar21 = (bool)((byte)(uVar54 >> 2) & 1);
                        bVar22 = (bool)((byte)(uVar54 >> 3) & 1);
                        bVar24 = (bool)((byte)(uVar54 >> 4) & 1);
                        bVar23 = (bool)((byte)(uVar54 >> 5) & 1);
                        bVar25 = (bool)((byte)(uVar54 >> 6) & 1);
                        bVar26 = SUB81(uVar54 >> 7,0);
                        *(uint *)(local_13d0.ray + 0x180) =
                             (uint)(bVar31 & 1) * (int)*(float *)local_13d0.hit |
                             (uint)!(bool)(bVar31 & 1) * *(int *)(local_13d0.ray + 0x180);
                        *(uint *)(local_13d0.ray + 0x184) =
                             (uint)bVar20 * (int)fVar135 |
                             (uint)!bVar20 * *(int *)(local_13d0.ray + 0x184);
                        *(uint *)(local_13d0.ray + 0x188) =
                             (uint)bVar21 * (int)fVar132 |
                             (uint)!bVar21 * *(int *)(local_13d0.ray + 0x188);
                        *(uint *)(local_13d0.ray + 0x18c) =
                             (uint)bVar22 * (int)fVar60 |
                             (uint)!bVar22 * *(int *)(local_13d0.ray + 0x18c);
                        *(uint *)(local_13d0.ray + 400) =
                             (uint)bVar24 * (int)fVar116 |
                             (uint)!bVar24 * *(int *)(local_13d0.ray + 400);
                        *(uint *)(local_13d0.ray + 0x194) =
                             (uint)bVar23 * (int)fVar117 |
                             (uint)!bVar23 * *(int *)(local_13d0.ray + 0x194);
                        *(uint *)(local_13d0.ray + 0x198) =
                             (uint)bVar25 * (int)fVar118 |
                             (uint)!bVar25 * *(int *)(local_13d0.ray + 0x198);
                        *(uint *)(local_13d0.ray + 0x19c) =
                             (uint)bVar26 * (int)fVar119 |
                             (uint)!bVar26 * *(int *)(local_13d0.ray + 0x19c);
                        fVar135 = *(float *)(local_13d0.hit + 0x24);
                        fVar132 = *(float *)(local_13d0.hit + 0x28);
                        fVar60 = *(float *)(local_13d0.hit + 0x2c);
                        fVar116 = *(float *)(local_13d0.hit + 0x30);
                        fVar117 = *(float *)(local_13d0.hit + 0x34);
                        fVar118 = *(float *)(local_13d0.hit + 0x38);
                        fVar119 = *(float *)(local_13d0.hit + 0x3c);
                        bVar20 = (bool)((byte)(uVar54 >> 1) & 1);
                        bVar21 = (bool)((byte)(uVar54 >> 2) & 1);
                        bVar22 = (bool)((byte)(uVar54 >> 3) & 1);
                        bVar24 = (bool)((byte)(uVar54 >> 4) & 1);
                        bVar23 = (bool)((byte)(uVar54 >> 5) & 1);
                        bVar25 = (bool)((byte)(uVar54 >> 6) & 1);
                        bVar26 = SUB81(uVar54 >> 7,0);
                        *(uint *)(local_13d0.ray + 0x1a0) =
                             (uint)(bVar31 & 1) * (int)*(float *)(local_13d0.hit + 0x20) |
                             (uint)!(bool)(bVar31 & 1) * *(int *)(local_13d0.ray + 0x1a0);
                        *(uint *)(local_13d0.ray + 0x1a4) =
                             (uint)bVar20 * (int)fVar135 |
                             (uint)!bVar20 * *(int *)(local_13d0.ray + 0x1a4);
                        *(uint *)(local_13d0.ray + 0x1a8) =
                             (uint)bVar21 * (int)fVar132 |
                             (uint)!bVar21 * *(int *)(local_13d0.ray + 0x1a8);
                        *(uint *)(local_13d0.ray + 0x1ac) =
                             (uint)bVar22 * (int)fVar60 |
                             (uint)!bVar22 * *(int *)(local_13d0.ray + 0x1ac);
                        *(uint *)(local_13d0.ray + 0x1b0) =
                             (uint)bVar24 * (int)fVar116 |
                             (uint)!bVar24 * *(int *)(local_13d0.ray + 0x1b0);
                        *(uint *)(local_13d0.ray + 0x1b4) =
                             (uint)bVar23 * (int)fVar117 |
                             (uint)!bVar23 * *(int *)(local_13d0.ray + 0x1b4);
                        *(uint *)(local_13d0.ray + 0x1b8) =
                             (uint)bVar25 * (int)fVar118 |
                             (uint)!bVar25 * *(int *)(local_13d0.ray + 0x1b8);
                        *(uint *)(local_13d0.ray + 0x1bc) =
                             (uint)bVar26 * (int)fVar119 |
                             (uint)!bVar26 * *(int *)(local_13d0.ray + 0x1bc);
                        fVar135 = *(float *)(local_13d0.hit + 0x44);
                        fVar132 = *(float *)(local_13d0.hit + 0x48);
                        fVar60 = *(float *)(local_13d0.hit + 0x4c);
                        fVar116 = *(float *)(local_13d0.hit + 0x50);
                        fVar117 = *(float *)(local_13d0.hit + 0x54);
                        fVar118 = *(float *)(local_13d0.hit + 0x58);
                        fVar119 = *(float *)(local_13d0.hit + 0x5c);
                        bVar20 = (bool)((byte)(uVar54 >> 1) & 1);
                        bVar21 = (bool)((byte)(uVar54 >> 2) & 1);
                        bVar22 = (bool)((byte)(uVar54 >> 3) & 1);
                        bVar24 = (bool)((byte)(uVar54 >> 4) & 1);
                        bVar23 = (bool)((byte)(uVar54 >> 5) & 1);
                        bVar25 = (bool)((byte)(uVar54 >> 6) & 1);
                        bVar26 = SUB81(uVar54 >> 7,0);
                        *(uint *)(local_13d0.ray + 0x1c0) =
                             (uint)(bVar31 & 1) * (int)*(float *)(local_13d0.hit + 0x40) |
                             (uint)!(bool)(bVar31 & 1) * *(int *)(local_13d0.ray + 0x1c0);
                        *(uint *)(local_13d0.ray + 0x1c4) =
                             (uint)bVar20 * (int)fVar135 |
                             (uint)!bVar20 * *(int *)(local_13d0.ray + 0x1c4);
                        *(uint *)(local_13d0.ray + 0x1c8) =
                             (uint)bVar21 * (int)fVar132 |
                             (uint)!bVar21 * *(int *)(local_13d0.ray + 0x1c8);
                        *(uint *)(local_13d0.ray + 0x1cc) =
                             (uint)bVar22 * (int)fVar60 |
                             (uint)!bVar22 * *(int *)(local_13d0.ray + 0x1cc);
                        *(uint *)(local_13d0.ray + 0x1d0) =
                             (uint)bVar24 * (int)fVar116 |
                             (uint)!bVar24 * *(int *)(local_13d0.ray + 0x1d0);
                        *(uint *)(local_13d0.ray + 0x1d4) =
                             (uint)bVar23 * (int)fVar117 |
                             (uint)!bVar23 * *(int *)(local_13d0.ray + 0x1d4);
                        *(uint *)(local_13d0.ray + 0x1d8) =
                             (uint)bVar25 * (int)fVar118 |
                             (uint)!bVar25 * *(int *)(local_13d0.ray + 0x1d8);
                        *(uint *)(local_13d0.ray + 0x1dc) =
                             (uint)bVar26 * (int)fVar119 |
                             (uint)!bVar26 * *(int *)(local_13d0.ray + 0x1dc);
                        fVar135 = *(float *)(local_13d0.hit + 100);
                        fVar132 = *(float *)(local_13d0.hit + 0x68);
                        fVar60 = *(float *)(local_13d0.hit + 0x6c);
                        fVar116 = *(float *)(local_13d0.hit + 0x70);
                        fVar117 = *(float *)(local_13d0.hit + 0x74);
                        fVar118 = *(float *)(local_13d0.hit + 0x78);
                        fVar119 = *(float *)(local_13d0.hit + 0x7c);
                        bVar20 = (bool)((byte)(uVar54 >> 1) & 1);
                        bVar21 = (bool)((byte)(uVar54 >> 2) & 1);
                        bVar22 = (bool)((byte)(uVar54 >> 3) & 1);
                        bVar24 = (bool)((byte)(uVar54 >> 4) & 1);
                        bVar23 = (bool)((byte)(uVar54 >> 5) & 1);
                        bVar25 = (bool)((byte)(uVar54 >> 6) & 1);
                        bVar26 = SUB81(uVar54 >> 7,0);
                        *(uint *)(local_13d0.ray + 0x1e0) =
                             (uint)(bVar31 & 1) * (int)*(float *)(local_13d0.hit + 0x60) |
                             (uint)!(bool)(bVar31 & 1) * *(int *)(local_13d0.ray + 0x1e0);
                        *(uint *)(local_13d0.ray + 0x1e4) =
                             (uint)bVar20 * (int)fVar135 |
                             (uint)!bVar20 * *(int *)(local_13d0.ray + 0x1e4);
                        *(uint *)(local_13d0.ray + 0x1e8) =
                             (uint)bVar21 * (int)fVar132 |
                             (uint)!bVar21 * *(int *)(local_13d0.ray + 0x1e8);
                        *(uint *)(local_13d0.ray + 0x1ec) =
                             (uint)bVar22 * (int)fVar60 |
                             (uint)!bVar22 * *(int *)(local_13d0.ray + 0x1ec);
                        *(uint *)(local_13d0.ray + 0x1f0) =
                             (uint)bVar24 * (int)fVar116 |
                             (uint)!bVar24 * *(int *)(local_13d0.ray + 0x1f0);
                        *(uint *)(local_13d0.ray + 500) =
                             (uint)bVar23 * (int)fVar117 |
                             (uint)!bVar23 * *(int *)(local_13d0.ray + 500);
                        *(uint *)(local_13d0.ray + 0x1f8) =
                             (uint)bVar25 * (int)fVar118 |
                             (uint)!bVar25 * *(int *)(local_13d0.ray + 0x1f8);
                        *(uint *)(local_13d0.ray + 0x1fc) =
                             (uint)bVar26 * (int)fVar119 |
                             (uint)!bVar26 * *(int *)(local_13d0.ray + 0x1fc);
                        auVar112 = *(undefined1 (*) [32])(local_13d0.ray + 0x200);
                        auVar114._0_4_ =
                             (uint)(bVar31 & 1) * (int)*(float *)(local_13d0.hit + 0x80) |
                             (uint)!(bool)(bVar31 & 1) * auVar112._0_4_;
                        bVar20 = (bool)((byte)(uVar54 >> 1) & 1);
                        auVar114._4_4_ =
                             (uint)bVar20 * (int)*(float *)(local_13d0.hit + 0x84) |
                             (uint)!bVar20 * auVar112._4_4_;
                        bVar20 = (bool)((byte)(uVar54 >> 2) & 1);
                        auVar114._8_4_ =
                             (uint)bVar20 * (int)*(float *)(local_13d0.hit + 0x88) |
                             (uint)!bVar20 * auVar112._8_4_;
                        bVar20 = (bool)((byte)(uVar54 >> 3) & 1);
                        auVar114._12_4_ =
                             (uint)bVar20 * (int)*(float *)(local_13d0.hit + 0x8c) |
                             (uint)!bVar20 * auVar112._12_4_;
                        bVar20 = (bool)((byte)(uVar54 >> 4) & 1);
                        auVar114._16_4_ =
                             (uint)bVar20 * (int)*(float *)(local_13d0.hit + 0x90) |
                             (uint)!bVar20 * auVar112._16_4_;
                        bVar20 = (bool)((byte)(uVar54 >> 5) & 1);
                        auVar114._20_4_ =
                             (uint)bVar20 * (int)*(float *)(local_13d0.hit + 0x94) |
                             (uint)!bVar20 * auVar112._20_4_;
                        bVar20 = (bool)((byte)(uVar54 >> 6) & 1);
                        auVar114._24_4_ =
                             (uint)bVar20 * (int)*(float *)(local_13d0.hit + 0x98) |
                             (uint)!bVar20 * auVar112._24_4_;
                        bVar20 = SUB81(uVar54 >> 7,0);
                        auVar114._28_4_ =
                             (uint)bVar20 * (int)*(float *)(local_13d0.hit + 0x9c) |
                             (uint)!bVar20 * auVar112._28_4_;
                        *(undefined1 (*) [32])(local_13d0.ray + 0x200) = auVar114;
                        auVar112 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_13d0.hit + 0xa0))
                        ;
                        *(undefined1 (*) [32])(local_13d0.ray + 0x220) = auVar112;
                        auVar112 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_13d0.hit + 0xc0))
                        ;
                        *(undefined1 (*) [32])(local_13d0.ray + 0x240) = auVar112;
                        auVar112 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_13d0.hit + 0xe0))
                        ;
                        *(undefined1 (*) [32])(local_13d0.ray + 0x260) = auVar112;
                        auVar112 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_13d0.hit + 0x100)
                                                     );
                        *(undefined1 (*) [32])(local_13d0.ray + 0x280) = auVar112;
                        local_1470._0_4_ = *(undefined4 *)(pRVar39 + sVar38 * 4 + 0x100);
                        local_1470._4_4_ = 0;
                        local_1470._8_4_ = 0;
                        local_1470._12_4_ = 0;
                      }
                      bVar31 = ~(byte)(1 << ((uint)uVar53 & 0x1f)) & (byte)uVar52;
                      auVar127._4_4_ = local_1470._0_4_;
                      auVar127._0_4_ = local_1470._0_4_;
                      auVar127._8_4_ = local_1470._0_4_;
                      auVar127._12_4_ = local_1470._0_4_;
                      auVar127._16_4_ = local_1470._0_4_;
                      auVar127._20_4_ = local_1470._0_4_;
                      auVar127._24_4_ = local_1470._0_4_;
                      auVar127._28_4_ = local_1470._0_4_;
                      uVar28 = vcmpps_avx512vl(auVar143._0_32_,auVar127,2);
                      if ((bVar31 & (byte)uVar28) == 0) goto LAB_01d6561f;
                      bVar31 = bVar31 & (byte)uVar28;
                      uVar52 = (ulong)bVar31;
                      auVar128._8_4_ = 0x7f800000;
                      auVar128._0_8_ = 0x7f8000007f800000;
                      auVar128._12_4_ = 0x7f800000;
                      auVar128._16_4_ = 0x7f800000;
                      auVar128._20_4_ = 0x7f800000;
                      auVar128._24_4_ = 0x7f800000;
                      auVar128._28_4_ = 0x7f800000;
                      auVar112 = vblendmps_avx512vl(auVar128,auVar143._0_32_);
                      auVar115._0_4_ =
                           (uint)(bVar31 & 1) * auVar112._0_4_ |
                           (uint)!(bool)(bVar31 & 1) * 0x7f800000;
                      bVar20 = (bool)(bVar31 >> 1 & 1);
                      auVar115._4_4_ = (uint)bVar20 * auVar112._4_4_ | (uint)!bVar20 * 0x7f800000;
                      bVar20 = (bool)(bVar31 >> 2 & 1);
                      auVar115._8_4_ = (uint)bVar20 * auVar112._8_4_ | (uint)!bVar20 * 0x7f800000;
                      bVar20 = (bool)(bVar31 >> 3 & 1);
                      auVar115._12_4_ = (uint)bVar20 * auVar112._12_4_ | (uint)!bVar20 * 0x7f800000;
                      bVar20 = (bool)(bVar31 >> 4 & 1);
                      auVar115._16_4_ = (uint)bVar20 * auVar112._16_4_ | (uint)!bVar20 * 0x7f800000;
                      bVar20 = (bool)(bVar31 >> 5 & 1);
                      auVar115._20_4_ = (uint)bVar20 * auVar112._20_4_ | (uint)!bVar20 * 0x7f800000;
                      bVar20 = (bool)(bVar31 >> 6 & 1);
                      auVar115._24_4_ = (uint)bVar20 * auVar112._24_4_ | (uint)!bVar20 * 0x7f800000;
                      auVar115._28_4_ =
                           (uint)(bVar31 >> 7) * auVar112._28_4_ |
                           (uint)!(bool)(bVar31 >> 7) * 0x7f800000;
                      auVar112 = vshufps_avx(auVar115,auVar115,0xb1);
                      auVar112 = vminps_avx(auVar115,auVar112);
                      auVar109 = vshufpd_avx(auVar112,auVar112,5);
                      auVar112 = vminps_avx(auVar112,auVar109);
                      auVar109 = vpermpd_avx2(auVar112,0x4e);
                      auVar112 = vminps_avx(auVar112,auVar109);
                      uVar28 = vcmpps_avx512vl(auVar115,auVar112,0);
                      bVar40 = (byte)uVar28 & bVar31;
                      if (bVar40 != 0) {
                        bVar31 = bVar40;
                      }
                      uVar44 = 0;
                      for (uVar46 = (uint)bVar31; (uVar46 & 1) == 0;
                          uVar46 = uVar46 >> 1 | 0x80000000) {
                        uVar44 = uVar44 + 1;
                      }
                      uVar53 = (ulong)uVar44;
                    } while( true );
                  }
                  uVar8 = *(undefined4 *)(local_11e0 + uVar53 * 4);
                  uVar9 = *(undefined4 *)(local_11c0 + uVar53 * 4);
                  fVar135 = local_1180[uVar53];
                  fVar132 = local_1160[uVar53];
                  uVar10 = *(undefined4 *)(local_1140 + uVar53 * 4);
                  *(float *)(local_1410 + local_1458 * 4 + 0x100) = local_1180[uVar53 - 8];
                  *(float *)(local_1410 + local_1458 * 4 + 0x180) = fVar135;
                  *(float *)(local_1410 + local_1458 * 4 + 0x1a0) = fVar132;
                  *(undefined4 *)(local_1410 + local_1458 * 4 + 0x1c0) = uVar10;
                  *(undefined4 *)(local_1410 + local_1458 * 4 + 0x1e0) = uVar8;
                  *(undefined4 *)(local_1410 + local_1458 * 4 + 0x200) = uVar9;
                  *(uint *)(local_1410 + local_1458 * 4 + 0x220) = uVar46;
                  *(uint *)(local_1410 + local_1458 * 4 + 0x240) = uVar44;
                  *(uint *)(local_1410 + local_1458 * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(local_1410 + local_1458 * 4 + 0x280) = context->user->instPrimID[0];
                }
              }
            }
          }
LAB_01d6561f:
          auVar164 = ZEXT1664(local_1290);
          auVar165 = ZEXT1664(local_12a0);
          auVar166 = ZEXT1664(local_12b0);
          auVar167 = ZEXT1664(local_12c0);
          auVar168 = ZEXT1664(local_12d0);
          auVar169 = ZEXT1664(local_1280);
          ray = pRVar39;
          uVar59 = local_1408;
          puVar51 = local_1400;
          uVar52 = local_1418;
          uVar53 = local_1420;
          uVar54 = local_1428;
          uVar55 = local_1438;
          uVar56 = local_1440;
          uVar58 = local_1430;
          k = sVar38;
        }
      }
      auVar147 = ZEXT1664(local_12e0);
      auVar143 = ZEXT1664(local_12f0);
      auVar159 = ZEXT1664(local_1300);
      auVar160 = ZEXT1664(local_1310);
      auVar162 = ZEXT1664(local_1320);
    }
    auVar61 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
    auVar169 = ZEXT1664(auVar61);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }